

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  float *pfVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [12];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  byte bVar61;
  ulong uVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  long lVar66;
  long lVar67;
  bool bVar68;
  ulong uVar69;
  uint uVar70;
  uint uVar121;
  uint uVar123;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  uint uVar127;
  uint uVar129;
  uint uVar131;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  uint uVar71;
  uint uVar122;
  uint uVar124;
  uint uVar125;
  uint uVar126;
  uint uVar128;
  uint uVar130;
  uint uVar132;
  uint uVar133;
  uint uVar134;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar158;
  float fVar159;
  vint4 bi_2;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar148 [32];
  float fVar160;
  float fVar161;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  float fVar165;
  vint4 bi_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  float fVar208;
  float fVar209;
  vint4 bi;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar210;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  vint4 ai_2;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  vint4 ai_1;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  vint4 ai;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar244;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined4 uVar251;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [64];
  float fVar256;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar257 [64];
  float fVar262;
  float fVar263;
  undefined1 auVar264 [32];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar265 [64];
  float fVar274;
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  undefined1 auVar277 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_8cc;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  ulong local_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  ulong local_808;
  RTCFilterFunctionNArguments local_800;
  uint local_7cc;
  uint local_7c8;
  undefined4 local_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_790 [16];
  undefined8 local_780;
  float local_778;
  float local_774;
  undefined4 local_770;
  uint local_76c;
  uint local_768;
  uint local_764;
  uint local_760;
  ulong local_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  Primitive *local_5b0;
  ulong local_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  byte abStack_180 [32];
  uint auStack_160 [8];
  float afStack_140 [2];
  uint auStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar113 [32];
  
  PVar8 = prim[1];
  uVar62 = (ulong)(byte)PVar8;
  lVar67 = uVar62 * 0x25;
  fVar135 = *(float *)(prim + lVar67 + 0x12);
  auVar79 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar67 + 6));
  auVar189._0_4_ = fVar135 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar189._4_4_ = fVar135 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar189._8_4_ = fVar135 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar189._12_4_ = fVar135 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar220._0_4_ = fVar135 * auVar79._0_4_;
  auVar220._4_4_ = fVar135 * auVar79._4_4_;
  auVar220._8_4_ = fVar135 * auVar79._8_4_;
  auVar220._12_4_ = fVar135 * auVar79._12_4_;
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xf + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar62 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1a + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1b + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1c + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar232._4_4_ = auVar189._0_4_;
  auVar232._0_4_ = auVar189._0_4_;
  auVar232._8_4_ = auVar189._0_4_;
  auVar232._12_4_ = auVar189._0_4_;
  auVar84 = vshufps_avx(auVar189,auVar189,0x55);
  auVar22 = vshufps_avx(auVar189,auVar189,0xaa);
  fVar135 = auVar22._0_4_;
  auVar190._0_4_ = fVar135 * auVar73._0_4_;
  fVar137 = auVar22._4_4_;
  auVar190._4_4_ = fVar137 * auVar73._4_4_;
  fVar159 = auVar22._8_4_;
  auVar190._8_4_ = fVar159 * auVar73._8_4_;
  fVar138 = auVar22._12_4_;
  auVar190._12_4_ = fVar138 * auVar73._12_4_;
  auVar166._0_4_ = auVar74._0_4_ * fVar135;
  auVar166._4_4_ = auVar74._4_4_ * fVar137;
  auVar166._8_4_ = auVar74._8_4_ * fVar159;
  auVar166._12_4_ = auVar74._12_4_ * fVar138;
  auVar139._0_4_ = auVar75._0_4_ * fVar135;
  auVar139._4_4_ = auVar75._4_4_ * fVar137;
  auVar139._8_4_ = auVar75._8_4_ * fVar159;
  auVar139._12_4_ = auVar75._12_4_ * fVar138;
  auVar22 = vfmadd231ps_fma(auVar190,auVar84,auVar79);
  auVar27 = vfmadd231ps_fma(auVar166,auVar84,auVar21);
  auVar84 = vfmadd231ps_fma(auVar139,auVar83,auVar84);
  auVar22 = vfmadd231ps_fma(auVar22,auVar232,auVar80);
  auVar27 = vfmadd231ps_fma(auVar27,auVar232,auVar82);
  auVar28 = vfmadd231ps_fma(auVar84,auVar81,auVar232);
  auVar280._4_4_ = auVar220._0_4_;
  auVar280._0_4_ = auVar220._0_4_;
  auVar280._8_4_ = auVar220._0_4_;
  auVar280._12_4_ = auVar220._0_4_;
  auVar84 = vshufps_avx(auVar220,auVar220,0x55);
  auVar72 = vshufps_avx512vl(auVar220,auVar220,0xaa);
  auVar73 = vmulps_avx512vl(auVar72,auVar73);
  auVar74 = vmulps_avx512vl(auVar72,auVar74);
  auVar75 = vmulps_avx512vl(auVar72,auVar75);
  auVar79 = vfmadd231ps_fma(auVar73,auVar84,auVar79);
  auVar73 = vfmadd231ps_fma(auVar74,auVar84,auVar21);
  auVar21 = vfmadd231ps_fma(auVar75,auVar84,auVar83);
  auVar29 = vfmadd231ps_fma(auVar79,auVar280,auVar80);
  auVar139 = vfmadd231ps_fma(auVar73,auVar280,auVar82);
  auVar252._8_4_ = 0x7fffffff;
  auVar252._0_8_ = 0x7fffffff7fffffff;
  auVar252._12_4_ = 0x7fffffff;
  auVar140 = vfmadd231ps_fma(auVar21,auVar280,auVar81);
  auVar80 = vandps_avx(auVar252,auVar22);
  auVar245._8_4_ = 0x219392ef;
  auVar245._0_8_ = 0x219392ef219392ef;
  auVar245._12_4_ = 0x219392ef;
  uVar69 = vcmpps_avx512vl(auVar80,auVar245,1);
  bVar14 = (bool)((byte)uVar69 & 1);
  auVar76._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar22._0_4_;
  bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar22._4_4_;
  bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar22._8_4_;
  bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar22._12_4_;
  auVar80 = vandps_avx(auVar252,auVar27);
  uVar69 = vcmpps_avx512vl(auVar80,auVar245,1);
  bVar14 = (bool)((byte)uVar69 & 1);
  auVar77._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar27._0_4_;
  bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar27._4_4_;
  bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar27._8_4_;
  bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar27._12_4_;
  auVar80 = vandps_avx(auVar252,auVar28);
  uVar69 = vcmpps_avx512vl(auVar80,auVar245,1);
  bVar14 = (bool)((byte)uVar69 & 1);
  auVar78._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar28._0_4_;
  bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar28._4_4_;
  bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar28._8_4_;
  bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar28._12_4_;
  auVar79 = vrcp14ps_avx512vl(auVar76);
  auVar246._8_4_ = 0x3f800000;
  auVar246._0_8_ = &DAT_3f8000003f800000;
  auVar246._12_4_ = 0x3f800000;
  auVar80 = vfnmadd213ps_fma(auVar76,auVar79,auVar246);
  auVar28 = vfmadd132ps_fma(auVar80,auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar77);
  auVar80 = vfnmadd213ps_fma(auVar77,auVar79,auVar246);
  auVar72 = vfmadd132ps_fma(auVar80,auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar78);
  auVar80 = vfnmadd213ps_fma(auVar78,auVar79,auVar246);
  auVar26 = vfmadd132ps_fma(auVar80,auVar79,auVar79);
  fVar135 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar67 + 0x16)) *
            *(float *)(prim + lVar67 + 0x1a);
  auVar238._4_4_ = fVar135;
  auVar238._0_4_ = fVar135;
  auVar238._8_4_ = fVar135;
  auVar238._12_4_ = fVar135;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar80 = vpmovsxwd_avx(auVar80);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar62 * 0xb + 6);
  auVar79 = vpmovsxwd_avx(auVar79);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar82 = vsubps_avx(auVar79,auVar80);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar79 = vpmovsxwd_avx(auVar73);
  auVar73 = vfmadd213ps_fma(auVar82,auVar238,auVar80);
  auVar80 = vcvtdq2ps_avx(auVar79);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar62 * 0xd + 6);
  auVar79 = vpmovsxwd_avx(auVar82);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar80);
  auVar82 = vfmadd213ps_fma(auVar79,auVar238,auVar80);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar62 * 0x12 + 6);
  auVar80 = vpmovsxwd_avx(auVar21);
  auVar80 = vcvtdq2ps_avx(auVar80);
  uVar69 = (ulong)(uint)((int)(uVar62 * 5) << 2);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar62 * 2 + uVar69 + 6);
  auVar79 = vpmovsxwd_avx(auVar74);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar80);
  auVar21 = vfmadd213ps_fma(auVar79,auVar238,auVar80);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar80 = vpmovsxwd_avx(auVar81);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar62 * 0x18 + 6);
  auVar79 = vpmovsxwd_avx(auVar83);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar80);
  auVar74 = vfmadd213ps_fma(auVar79,auVar238,auVar80);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar62 * 0x1d + 6);
  auVar80 = vpmovsxwd_avx(auVar75);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar62 + (ulong)(byte)PVar8 * 0x20 + 6);
  auVar79 = vpmovsxwd_avx(auVar84);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar80);
  auVar81 = vfmadd213ps_fma(auVar79,auVar238,auVar80);
  auVar278 = ZEXT1664(auVar81);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar8 * 0x20 - uVar62) + 6);
  auVar80 = vpmovsxwd_avx(auVar22);
  auVar80 = vcvtdq2ps_avx(auVar80);
  local_5b0 = prim;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar62 * 0x23 + 6);
  auVar79 = vpmovsxwd_avx(auVar27);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar80);
  auVar79 = vfmadd213ps_fma(auVar79,auVar238,auVar80);
  auVar80 = vsubps_avx(auVar73,auVar29);
  auVar239._0_4_ = auVar28._0_4_ * auVar80._0_4_;
  auVar239._4_4_ = auVar28._4_4_ * auVar80._4_4_;
  auVar239._8_4_ = auVar28._8_4_ * auVar80._8_4_;
  auVar239._12_4_ = auVar28._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar82,auVar29);
  auVar191._0_4_ = auVar28._0_4_ * auVar80._0_4_;
  auVar191._4_4_ = auVar28._4_4_ * auVar80._4_4_;
  auVar191._8_4_ = auVar28._8_4_ * auVar80._8_4_;
  auVar191._12_4_ = auVar28._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar21,auVar139);
  auVar233._0_4_ = auVar72._0_4_ * auVar80._0_4_;
  auVar233._4_4_ = auVar72._4_4_ * auVar80._4_4_;
  auVar233._8_4_ = auVar72._8_4_ * auVar80._8_4_;
  auVar233._12_4_ = auVar72._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar74,auVar139);
  auVar167._0_4_ = auVar72._0_4_ * auVar80._0_4_;
  auVar167._4_4_ = auVar72._4_4_ * auVar80._4_4_;
  auVar167._8_4_ = auVar72._8_4_ * auVar80._8_4_;
  auVar167._12_4_ = auVar72._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar81,auVar140);
  auVar221._0_4_ = auVar26._0_4_ * auVar80._0_4_;
  auVar221._4_4_ = auVar26._4_4_ * auVar80._4_4_;
  auVar221._8_4_ = auVar26._8_4_ * auVar80._8_4_;
  auVar221._12_4_ = auVar26._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar79,auVar140);
  auVar140._0_4_ = auVar26._0_4_ * auVar80._0_4_;
  auVar140._4_4_ = auVar26._4_4_ * auVar80._4_4_;
  auVar140._8_4_ = auVar26._8_4_ * auVar80._8_4_;
  auVar140._12_4_ = auVar26._12_4_ * auVar80._12_4_;
  auVar80 = vpminsd_avx(auVar239,auVar191);
  auVar79 = vpminsd_avx(auVar233,auVar167);
  auVar80 = vmaxps_avx(auVar80,auVar79);
  auVar79 = vpminsd_avx(auVar221,auVar140);
  uVar251 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar28._4_4_ = uVar251;
  auVar28._0_4_ = uVar251;
  auVar28._8_4_ = uVar251;
  auVar28._12_4_ = uVar251;
  auVar79 = vmaxps_avx512vl(auVar79,auVar28);
  auVar80 = vmaxps_avx(auVar80,auVar79);
  auVar72._8_4_ = 0x3f7ffffa;
  auVar72._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar72._12_4_ = 0x3f7ffffa;
  local_490 = vmulps_avx512vl(auVar80,auVar72);
  auVar80 = vpmaxsd_avx(auVar239,auVar191);
  auVar79 = vpmaxsd_avx(auVar233,auVar167);
  auVar80 = vminps_avx(auVar80,auVar79);
  auVar79 = vpmaxsd_avx(auVar221,auVar140);
  fVar135 = (ray->super_RayK<1>).tfar;
  auVar26._4_4_ = fVar135;
  auVar26._0_4_ = fVar135;
  auVar26._8_4_ = fVar135;
  auVar26._12_4_ = fVar135;
  auVar79 = vminps_avx512vl(auVar79,auVar26);
  auVar80 = vminps_avx(auVar80,auVar79);
  auVar29._8_4_ = 0x3f800003;
  auVar29._0_8_ = 0x3f8000033f800003;
  auVar29._12_4_ = 0x3f800003;
  auVar80 = vmulps_avx512vl(auVar80,auVar29);
  auVar79 = vpbroadcastd_avx512vl();
  uVar23 = vcmpps_avx512vl(local_490,auVar80,2);
  uVar69 = vpcmpgtd_avx512vl(auVar79,_DAT_01ff0cf0);
  uVar69 = ((byte)uVar23 & 0xf) & uVar69;
  if ((char)uVar69 == '\0') {
    return;
  }
  auVar279 = ZEXT864(0) << 0x20;
  auVar265 = ZEXT3264(_DAT_02020f20);
LAB_01c2d8ae:
  local_5a8 = uVar69;
  lVar67 = 0;
  for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    lVar67 = lVar67 + 1;
  }
  local_8c8 = (ulong)*(uint *)(local_5b0 + 2);
  pGVar9 = (context->scene->geometries).items[*(uint *)(local_5b0 + 2)].ptr;
  local_888 = (ulong)*(uint *)(local_5b0 + lVar67 * 4 + 6);
  uVar69 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)*(uint *)(local_5b0 + lVar67 * 4 + 6) *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar135 = (pGVar9->time_range).lower;
  fVar135 = pGVar9->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar135) /
            ((pGVar9->time_range).upper - fVar135));
  auVar80 = vroundss_avx(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),9);
  auVar80 = vminss_avx(auVar80,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar80 = vmaxss_avx(ZEXT816(0) << 0x20,auVar80);
  fVar135 = fVar135 - auVar80._0_4_;
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar66 = (long)(int)auVar80._0_4_ * 0x38;
  lVar67 = *(long *)(_Var10 + 0x10 + lVar66);
  lVar11 = *(long *)(_Var10 + 0x38 + lVar66);
  lVar12 = *(long *)(_Var10 + 0x48 + lVar66);
  pfVar5 = (float *)(lVar11 + uVar69 * lVar12);
  auVar192._0_4_ = fVar135 * *pfVar5;
  auVar192._4_4_ = fVar135 * pfVar5[1];
  auVar192._8_4_ = fVar135 * pfVar5[2];
  auVar192._12_4_ = fVar135 * pfVar5[3];
  pfVar5 = (float *)(lVar11 + (uVar69 + 1) * lVar12);
  auVar211._0_4_ = fVar135 * *pfVar5;
  auVar211._4_4_ = fVar135 * pfVar5[1];
  auVar211._8_4_ = fVar135 * pfVar5[2];
  auVar211._12_4_ = fVar135 * pfVar5[3];
  pfVar5 = (float *)(lVar11 + (uVar69 + 2) * lVar12);
  auVar222._0_4_ = fVar135 * *pfVar5;
  auVar222._4_4_ = fVar135 * pfVar5[1];
  auVar222._8_4_ = fVar135 * pfVar5[2];
  auVar222._12_4_ = fVar135 * pfVar5[3];
  pfVar5 = (float *)(lVar11 + lVar12 * (uVar69 + 3));
  auVar168._0_4_ = fVar135 * *pfVar5;
  auVar168._4_4_ = fVar135 * pfVar5[1];
  auVar168._8_4_ = fVar135 * pfVar5[2];
  auVar168._12_4_ = fVar135 * pfVar5[3];
  lVar11 = *(long *)(_Var10 + lVar66);
  fVar135 = 1.0 - fVar135;
  auVar141._4_4_ = fVar135;
  auVar141._0_4_ = fVar135;
  auVar141._8_4_ = fVar135;
  auVar141._12_4_ = fVar135;
  auVar73 = vfmadd231ps_fma(auVar192,auVar141,*(undefined1 (*) [16])(lVar11 + lVar67 * uVar69));
  auVar82 = vfmadd231ps_fma(auVar211,auVar141,*(undefined1 (*) [16])(lVar11 + lVar67 * (uVar69 + 1))
                           );
  auVar21 = vfmadd231ps_fma(auVar222,auVar141,*(undefined1 (*) [16])(lVar11 + lVar67 * (uVar69 + 2))
                           );
  auVar74 = vfmadd231ps_fma(auVar168,auVar141,*(undefined1 (*) [16])(lVar11 + lVar67 * (uVar69 + 3))
                           );
  auVar234._0_4_ = auVar73._0_4_ + auVar82._0_4_ + auVar21._0_4_ + auVar74._0_4_;
  auVar234._4_4_ = auVar73._4_4_ + auVar82._4_4_ + auVar21._4_4_ + auVar74._4_4_;
  auVar234._8_4_ = auVar73._8_4_ + auVar82._8_4_ + auVar21._8_4_ + auVar74._8_4_;
  auVar234._12_4_ = auVar73._12_4_ + auVar82._12_4_ + auVar21._12_4_ + auVar74._12_4_;
  aVar6 = (ray->super_RayK<1>).org.field_0;
  aVar7 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar30._8_4_ = 0x3e800000;
  auVar30._0_8_ = 0x3e8000003e800000;
  auVar30._12_4_ = 0x3e800000;
  auVar80 = vmulps_avx512vl(auVar234,auVar30);
  auVar80 = vsubps_avx(auVar80,(undefined1  [16])aVar6);
  auVar80 = vdpps_avx(auVar80,(undefined1  [16])aVar7,0x7f);
  auVar79 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
  auVar253._4_12_ = auVar279._4_12_;
  auVar253._0_4_ = auVar79._0_4_;
  auVar81 = vrcp14ss_avx512f(auVar279._0_16_,auVar253);
  auVar79 = vfnmadd213ss_fma(auVar81,auVar79,ZEXT416(0x40000000));
  fVar135 = auVar80._0_4_ * auVar81._0_4_ * auVar79._0_4_;
  local_620 = ZEXT416((uint)fVar135);
  auVar247._4_4_ = fVar135;
  auVar247._0_4_ = fVar135;
  auVar247._8_4_ = fVar135;
  auVar247._12_4_ = fVar135;
  fStack_670 = fVar135;
  _local_680 = auVar247;
  fStack_66c = fVar135;
  fStack_668 = fVar135;
  fStack_664 = fVar135;
  auVar80 = vfmadd231ps_fma((undefined1  [16])aVar6,(undefined1  [16])aVar7,auVar247);
  auVar80 = vblendps_avx(auVar80,auVar279._0_16_,8);
  auVar79 = vsubps_avx(auVar73,auVar80);
  uVar251 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_520._4_4_ = uVar251;
  local_520._0_4_ = uVar251;
  local_520._8_4_ = uVar251;
  local_520._12_4_ = uVar251;
  local_520._16_4_ = uVar251;
  local_520._20_4_ = uVar251;
  local_520._24_4_ = uVar251;
  local_520._28_4_ = uVar251;
  auVar255 = ZEXT3264(local_520);
  auVar73 = vsubps_avx(auVar21,auVar80);
  uVar251 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_540._4_4_ = uVar251;
  local_540._0_4_ = uVar251;
  local_540._8_4_ = uVar251;
  local_540._12_4_ = uVar251;
  local_540._16_4_ = uVar251;
  local_540._20_4_ = uVar251;
  local_540._24_4_ = uVar251;
  local_540._28_4_ = uVar251;
  auVar257 = ZEXT3264(local_540);
  local_560 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  uStack_55c = local_560;
  uStack_558 = local_560;
  uStack_554 = local_560;
  uStack_550 = local_560;
  uStack_54c = local_560;
  uStack_548 = local_560;
  uStack_544 = local_560;
  auVar82 = vsubps_avx(auVar82,auVar80);
  auVar273 = ZEXT1664(auVar82);
  auVar80 = vsubps_avx(auVar74,auVar80);
  auVar237 = ZEXT1664(auVar80);
  local_1a0 = auVar79._0_4_;
  uStack_19c = local_1a0;
  uStack_198 = local_1a0;
  uStack_194 = local_1a0;
  uStack_190 = local_1a0;
  uStack_18c = local_1a0;
  uStack_188 = local_1a0;
  uStack_184 = local_1a0;
  auVar85._8_4_ = 1;
  auVar85._0_8_ = 0x100000001;
  auVar85._12_4_ = 1;
  auVar85._16_4_ = 1;
  auVar85._20_4_ = 1;
  auVar85._24_4_ = 1;
  auVar85._28_4_ = 1;
  local_6a0 = ZEXT1632(auVar79);
  local_1c0 = vpermps_avx2(auVar85,local_6a0);
  auVar86._8_4_ = 2;
  auVar86._0_8_ = 0x200000002;
  auVar86._12_4_ = 2;
  auVar86._16_4_ = 2;
  auVar86._20_4_ = 2;
  auVar86._24_4_ = 2;
  auVar86._28_4_ = 2;
  local_1e0 = vpermps_avx2(auVar86,local_6a0);
  auVar87._8_4_ = 3;
  auVar87._0_8_ = 0x300000003;
  auVar87._12_4_ = 3;
  auVar87._16_4_ = 3;
  auVar87._20_4_ = 3;
  auVar87._24_4_ = 3;
  auVar87._28_4_ = 3;
  local_200 = vpermps_avx2(auVar87,local_6a0);
  local_220 = auVar82._0_4_;
  uStack_21c = local_220;
  uStack_218 = local_220;
  uStack_214 = local_220;
  uStack_210 = local_220;
  uStack_20c = local_220;
  uStack_208 = local_220;
  uStack_204 = local_220;
  local_6e0 = ZEXT1632(auVar82);
  local_240 = vpermps_avx2(auVar85,local_6e0);
  local_260 = vpermps_avx2(auVar86,local_6e0);
  local_280 = vpermps_avx2(auVar87,local_6e0);
  local_2a0 = auVar73._0_4_;
  uStack_29c = local_2a0;
  uStack_298 = local_2a0;
  uStack_294 = local_2a0;
  uStack_290 = local_2a0;
  uStack_28c = local_2a0;
  uStack_288 = local_2a0;
  uStack_284 = local_2a0;
  local_6c0 = ZEXT1632(auVar73);
  local_2c0 = vpermps_avx2(auVar85,local_6c0);
  local_2e0 = vpermps_avx2(auVar86,local_6c0);
  local_300 = vpermps_avx2(auVar87,local_6c0);
  local_320 = auVar80._0_4_;
  uStack_31c = local_320;
  uStack_318 = local_320;
  uStack_314 = local_320;
  uStack_310 = local_320;
  uStack_30c = local_320;
  uStack_308 = local_320;
  uStack_304 = local_320;
  _local_700 = ZEXT1632(auVar80);
  local_340 = vpermps_avx2(auVar85,_local_700);
  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  local_360 = vpermps_avx2(auVar86,_local_700);
  local_380 = vpermps_avx2(auVar87,_local_700);
  auVar93 = vpermps_avx2(auVar86,ZEXT1632(CONCAT412(aVar7.field_3.w * aVar7.field_3.w,
                                                    CONCAT48(aVar7.z * aVar7.z,
                                                             CONCAT44(aVar7.y * aVar7.y,
                                                                      aVar7.x * aVar7.x)))));
  auVar80 = vfmadd231ps_fma(auVar93,local_540,local_540);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),local_520,local_520);
  local_3a0 = ZEXT1632(auVar80);
  auVar93._8_4_ = 0x7fffffff;
  auVar93._0_8_ = 0x7fffffff7fffffff;
  auVar93._12_4_ = 0x7fffffff;
  auVar93._16_4_ = 0x7fffffff;
  auVar93._20_4_ = 0x7fffffff;
  auVar93._24_4_ = 0x7fffffff;
  auVar93._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar80),auVar93);
  local_460 = auVar85;
  local_748 = 1;
  local_808 = 0;
  auVar219 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    auVar80 = vmovshdup_avx(auVar219._0_16_);
    fVar137 = auVar219._0_4_;
    fVar135 = auVar80._0_4_ - fVar137;
    fVar261 = fVar135 * 0.04761905;
    local_790 = auVar219._0_16_;
    local_860._4_4_ = fVar137;
    local_860._0_4_ = fVar137;
    local_860._8_4_ = fVar137;
    local_860._12_4_ = fVar137;
    local_860._16_4_ = fVar137;
    local_860._20_4_ = fVar137;
    local_860._24_4_ = fVar137;
    local_860._28_4_ = fVar137;
    local_8c0._4_4_ = fVar135;
    local_8c0._0_4_ = fVar135;
    local_8c0._8_4_ = fVar135;
    local_8c0._12_4_ = fVar135;
    local_8c0._16_4_ = fVar135;
    local_8c0._20_4_ = fVar135;
    local_8c0._24_4_ = fVar135;
    local_8c0._28_4_ = fVar135;
    auVar80 = vfmadd231ps_fma(local_860,local_8c0,auVar265._0_32_);
    auVar148._8_4_ = 0x3f800000;
    auVar148._0_8_ = &DAT_3f8000003f800000;
    auVar148._12_4_ = 0x3f800000;
    auVar148._16_4_ = 0x3f800000;
    auVar148._20_4_ = 0x3f800000;
    auVar148._24_4_ = 0x3f800000;
    auVar148._28_4_ = 0x3f800000;
    auVar93 = vsubps_avx(auVar148,ZEXT1632(auVar80));
    fVar135 = auVar93._0_4_;
    fVar159 = auVar93._4_4_;
    fVar165 = auVar93._8_4_;
    fVar263 = auVar93._12_4_;
    fVar258 = auVar93._16_4_;
    fVar259 = auVar93._20_4_;
    fVar260 = auVar93._24_4_;
    fVar136 = fVar135 * fVar135 * fVar135;
    fVar158 = fVar159 * fVar159 * fVar159;
    fVar160 = fVar165 * fVar165 * fVar165;
    fVar161 = fVar263 * fVar263 * fVar263;
    fVar162 = fVar258 * fVar258 * fVar258;
    fVar163 = fVar259 * fVar259 * fVar259;
    fVar164 = fVar260 * fVar260 * fVar260;
    fVar137 = auVar80._0_4_;
    fVar138 = auVar80._4_4_;
    fVar244 = auVar80._8_4_;
    fVar256 = auVar80._12_4_;
    fVar188 = fVar137 * fVar137 * fVar137;
    fVar208 = fVar138 * fVar138 * fVar138;
    fVar209 = fVar244 * fVar244 * fVar244;
    fVar210 = fVar256 * fVar256 * fVar256;
    fVar262 = fVar137 * fVar135;
    fVar266 = fVar138 * fVar159;
    fVar267 = fVar244 * fVar165;
    fVar268 = fVar256 * fVar263;
    fVar269 = fVar258 * 0.0;
    fVar270 = fVar259 * 0.0;
    fVar271 = fVar260 * 0.0;
    fVar274 = auVar273._28_4_ + auVar279._28_4_ + 1.0;
    auVar92._4_4_ = fVar158 * 0.16666667;
    auVar92._0_4_ = fVar136 * 0.16666667;
    auVar92._8_4_ = fVar160 * 0.16666667;
    auVar92._12_4_ = fVar161 * 0.16666667;
    auVar92._16_4_ = fVar162 * 0.16666667;
    auVar92._20_4_ = fVar163 * 0.16666667;
    auVar92._24_4_ = fVar164 * 0.16666667;
    auVar92._28_4_ = fVar274;
    auVar90._4_4_ =
         (fVar266 * fVar159 * 12.0 + fVar266 * fVar138 * 6.0 + fVar208 + fVar158 * 4.0) * 0.16666667
    ;
    auVar90._0_4_ =
         (fVar262 * fVar135 * 12.0 + fVar262 * fVar137 * 6.0 + fVar188 + fVar136 * 4.0) * 0.16666667
    ;
    auVar90._8_4_ =
         (fVar267 * fVar165 * 12.0 + fVar267 * fVar244 * 6.0 + fVar209 + fVar160 * 4.0) * 0.16666667
    ;
    auVar90._12_4_ =
         (fVar268 * fVar263 * 12.0 + fVar268 * fVar256 * 6.0 + fVar210 + fVar161 * 4.0) * 0.16666667
    ;
    auVar90._16_4_ =
         (fVar269 * fVar258 * 12.0 + fVar269 * 0.0 * 6.0 + fVar162 * 4.0 + 0.0) * 0.16666667;
    auVar90._20_4_ =
         (fVar270 * fVar259 * 12.0 + fVar270 * 0.0 * 6.0 + fVar163 * 4.0 + 0.0) * 0.16666667;
    auVar90._24_4_ =
         (fVar271 * fVar260 * 12.0 + fVar271 * 0.0 * 6.0 + fVar164 * 4.0 + 0.0) * 0.16666667;
    auVar90._28_4_ = auVar278._28_4_;
    auVar91._4_4_ =
         (fVar208 * 4.0 + fVar158 + fVar266 * fVar138 * 12.0 + fVar266 * fVar159 * 6.0) * 0.16666667
    ;
    auVar91._0_4_ =
         (fVar188 * 4.0 + fVar136 + fVar262 * fVar137 * 12.0 + fVar262 * fVar135 * 6.0) * 0.16666667
    ;
    auVar91._8_4_ =
         (fVar209 * 4.0 + fVar160 + fVar267 * fVar244 * 12.0 + fVar267 * fVar165 * 6.0) * 0.16666667
    ;
    auVar91._12_4_ =
         (fVar210 * 4.0 + fVar161 + fVar268 * fVar256 * 12.0 + fVar268 * fVar263 * 6.0) * 0.16666667
    ;
    auVar91._16_4_ = (fVar162 + 0.0 + fVar269 * 0.0 * 12.0 + fVar269 * fVar258 * 6.0) * 0.16666667;
    auVar91._20_4_ = (fVar163 + 0.0 + fVar270 * 0.0 * 12.0 + fVar270 * fVar259 * 6.0) * 0.16666667;
    auVar91._24_4_ = (fVar164 + 0.0 + fVar271 * 0.0 * 12.0 + fVar271 * fVar260 * 6.0) * 0.16666667;
    auVar91._28_4_ = auVar279._28_4_;
    auVar94._28_4_ = fVar274 + auVar278._28_4_ + auVar237._28_4_;
    auVar94._0_28_ =
         ZEXT1628(CONCAT412(fVar210 * 0.16666667,
                            CONCAT48(fVar209 * 0.16666667,
                                     CONCAT44(fVar208 * 0.16666667,fVar188 * 0.16666667))));
    auVar185._4_4_ = uStack_31c;
    auVar185._0_4_ = local_320;
    auVar185._8_4_ = uStack_318;
    auVar185._12_4_ = uStack_314;
    auVar185._16_4_ = uStack_310;
    auVar185._20_4_ = uStack_30c;
    auVar185._24_4_ = uStack_308;
    auVar185._28_4_ = uStack_304;
    auVar86 = vmulps_avx512vl(auVar185,auVar94);
    auVar87 = vmulps_avx512vl(local_340,auVar94);
    auVar88 = vmulps_avx512vl(local_360,auVar94);
    auVar89 = vmulps_avx512vl(local_380,auVar94);
    auVar203._4_4_ = uStack_29c;
    auVar203._0_4_ = local_2a0;
    auVar203._8_4_ = uStack_298;
    auVar203._12_4_ = uStack_294;
    auVar203._16_4_ = uStack_290;
    auVar203._20_4_ = uStack_28c;
    auVar203._24_4_ = uStack_288;
    auVar203._28_4_ = uStack_284;
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar91,auVar203);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar91,local_2c0);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,local_2e0);
    auVar89 = vfmadd231ps_avx512vl(auVar89,local_300,auVar91);
    auVar111._4_4_ = uStack_21c;
    auVar111._0_4_ = local_220;
    auVar111._8_4_ = uStack_218;
    auVar111._12_4_ = uStack_214;
    auVar111._16_4_ = uStack_210;
    auVar111._20_4_ = uStack_20c;
    auVar111._24_4_ = uStack_208;
    auVar111._28_4_ = uStack_204;
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar90,auVar111);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar90,local_240);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar90,local_260);
    auVar90 = vfmadd231ps_avx512vl(auVar89,local_280,auVar90);
    auVar112._4_4_ = uStack_19c;
    auVar112._0_4_ = local_1a0;
    auVar112._8_4_ = uStack_198;
    auVar112._12_4_ = uStack_194;
    auVar112._16_4_ = uStack_190;
    auVar112._20_4_ = uStack_18c;
    auVar112._24_4_ = uStack_188;
    auVar112._28_4_ = uStack_184;
    auVar79 = vfmadd231ps_fma(auVar86,auVar92,auVar112);
    auVar73 = vfmadd231ps_fma(auVar87,auVar92,local_1c0);
    auVar91 = vfmadd231ps_avx512vl(auVar88,auVar92,local_1e0);
    auVar87 = vfmadd231ps_avx512vl(auVar90,local_200,auVar92);
    auVar92 = vxorps_avx512vl(auVar93,auVar85);
    auVar90 = vxorps_avx512vl(ZEXT1632(auVar80),auVar85);
    auVar227._0_4_ = auVar90._0_4_ * fVar137;
    auVar227._4_4_ = auVar90._4_4_ * fVar138;
    auVar227._8_4_ = auVar90._8_4_ * fVar244;
    auVar227._12_4_ = auVar90._12_4_ * fVar256;
    auVar227._16_4_ = auVar90._16_4_ * 0.0;
    auVar227._20_4_ = auVar90._20_4_ * 0.0;
    auVar227._24_4_ = auVar90._24_4_ * 0.0;
    auVar227._28_4_ = 0;
    auVar96._4_4_ = fVar266 * 4.0;
    auVar96._0_4_ = fVar262 * 4.0;
    auVar96._8_4_ = fVar267 * 4.0;
    auVar96._12_4_ = fVar268 * 4.0;
    auVar96._16_4_ = fVar269 * 4.0;
    auVar96._20_4_ = fVar270 * 4.0;
    auVar96._24_4_ = fVar271 * 4.0;
    auVar96._28_4_ = auVar265._28_4_;
    auVar86 = vsubps_avx(auVar227,auVar96);
    auVar97._4_4_ = auVar92._4_4_ * fVar159 * 0.5;
    auVar97._0_4_ = auVar92._0_4_ * fVar135 * 0.5;
    auVar97._8_4_ = auVar92._8_4_ * fVar165 * 0.5;
    auVar97._12_4_ = auVar92._12_4_ * fVar263 * 0.5;
    auVar97._16_4_ = auVar92._16_4_ * fVar258 * 0.5;
    auVar97._20_4_ = auVar92._20_4_ * fVar259 * 0.5;
    auVar97._24_4_ = auVar92._24_4_ * fVar260 * 0.5;
    auVar97._28_4_ = auVar93._28_4_;
    auVar98._4_4_ = auVar86._4_4_ * 0.5;
    auVar98._0_4_ = auVar86._0_4_ * 0.5;
    auVar98._8_4_ = auVar86._8_4_ * 0.5;
    auVar98._12_4_ = auVar86._12_4_ * 0.5;
    auVar98._16_4_ = auVar86._16_4_ * 0.5;
    auVar98._20_4_ = auVar86._20_4_ * 0.5;
    auVar98._24_4_ = auVar86._24_4_ * 0.5;
    auVar98._28_4_ = auVar86._28_4_;
    auVar99._4_4_ = (fVar159 * fVar159 + fVar266 * 4.0) * 0.5;
    auVar99._0_4_ = (fVar135 * fVar135 + fVar262 * 4.0) * 0.5;
    auVar99._8_4_ = (fVar165 * fVar165 + fVar267 * 4.0) * 0.5;
    auVar99._12_4_ = (fVar263 * fVar263 + fVar268 * 4.0) * 0.5;
    auVar99._16_4_ = (fVar258 * fVar258 + fVar269 * 4.0) * 0.5;
    auVar99._20_4_ = (fVar259 * fVar259 + fVar270 * 4.0) * 0.5;
    auVar99._24_4_ = (fVar260 * fVar260 + fVar271 * 4.0) * 0.5;
    auVar99._28_4_ = auVar255._28_4_ + auVar265._28_4_;
    auVar103._28_4_ = auVar257._28_4_;
    auVar103._0_28_ =
         ZEXT1628(CONCAT412(fVar256 * fVar256 * 0.5,
                            CONCAT48(fVar244 * fVar244 * 0.5,
                                     CONCAT44(fVar138 * fVar138 * 0.5,fVar137 * fVar137 * 0.5))));
    auVar93 = vmulps_avx512vl(auVar185,auVar103);
    auVar86 = vmulps_avx512vl(local_340,auVar103);
    auVar92 = vmulps_avx512vl(local_360,auVar103);
    auVar88 = vmulps_avx512vl(local_380,auVar103);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,auVar203);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar99,local_2c0);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,local_2e0);
    auVar88 = vfmadd231ps_avx512vl(auVar88,local_300,auVar99);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar111);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar98,local_240);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar98,local_260);
    auVar88 = vfmadd231ps_avx512vl(auVar88,local_280,auVar98);
    auVar80 = vfmadd231ps_fma(auVar93,auVar97,auVar112);
    auVar82 = vfmadd231ps_fma(auVar86,auVar97,local_1c0);
    auVar93 = vfmadd231ps_avx512vl(auVar92,auVar97,local_1e0);
    auVar86 = vfmadd231ps_avx512vl(auVar88,local_200,auVar97);
    auVar109._4_4_ = auVar80._4_4_ * fVar261;
    auVar109._0_4_ = auVar80._0_4_ * fVar261;
    auVar109._8_4_ = auVar80._8_4_ * fVar261;
    auVar109._12_4_ = auVar80._12_4_ * fVar261;
    auVar109._16_4_ = fVar261 * 0.0;
    auVar109._20_4_ = fVar261 * 0.0;
    auVar109._24_4_ = fVar261 * 0.0;
    auVar109._28_4_ = auVar90._28_4_;
    auVar277._0_4_ = auVar82._0_4_ * fVar261;
    auVar277._4_4_ = auVar82._4_4_ * fVar261;
    auVar277._8_4_ = auVar82._8_4_ * fVar261;
    auVar277._12_4_ = auVar82._12_4_ * fVar261;
    auVar277._16_4_ = fVar261 * 0.0;
    auVar277._20_4_ = fVar261 * 0.0;
    auVar277._24_4_ = fVar261 * 0.0;
    auVar277._28_4_ = 0;
    auVar278 = ZEXT3264(auVar277);
    auVar110._4_4_ = auVar93._4_4_ * fVar261;
    auVar110._0_4_ = auVar93._0_4_ * fVar261;
    auVar110._8_4_ = auVar93._8_4_ * fVar261;
    auVar110._12_4_ = auVar93._12_4_ * fVar261;
    auVar110._16_4_ = auVar93._16_4_ * fVar261;
    auVar110._20_4_ = auVar93._20_4_ * fVar261;
    auVar110._24_4_ = auVar93._24_4_ * fVar261;
    auVar110._28_4_ = auVar93._28_4_;
    auVar242._0_4_ = auVar86._0_4_ * fVar261;
    auVar242._4_4_ = auVar86._4_4_ * fVar261;
    auVar242._8_4_ = auVar86._8_4_ * fVar261;
    auVar242._12_4_ = auVar86._12_4_ * fVar261;
    auVar242._16_4_ = auVar86._16_4_ * fVar261;
    auVar242._20_4_ = auVar86._20_4_ * fVar261;
    auVar242._24_4_ = auVar86._24_4_ * fVar261;
    auVar242._28_4_ = 0;
    auVar80 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar94 = vpermt2ps_avx512vl(ZEXT1632(auVar79),_DAT_0205fd20,ZEXT1632(auVar80));
    auVar255 = ZEXT3264(auVar94);
    auVar95 = vpermt2ps_avx512vl(ZEXT1632(auVar73),_DAT_0205fd20,ZEXT1632(auVar80));
    auVar92 = ZEXT1632(auVar80);
    auVar96 = vpermt2ps_avx512vl(auVar91,_DAT_0205fd20,auVar92);
    auVar228._0_4_ = auVar242._0_4_ + auVar87._0_4_;
    auVar228._4_4_ = auVar242._4_4_ + auVar87._4_4_;
    auVar228._8_4_ = auVar242._8_4_ + auVar87._8_4_;
    auVar228._12_4_ = auVar242._12_4_ + auVar87._12_4_;
    auVar228._16_4_ = auVar242._16_4_ + auVar87._16_4_;
    auVar228._20_4_ = auVar242._20_4_ + auVar87._20_4_;
    auVar228._24_4_ = auVar242._24_4_ + auVar87._24_4_;
    auVar228._28_4_ = auVar87._28_4_ + 0.0;
    auVar93 = vmaxps_avx(auVar87,auVar228);
    auVar86 = vminps_avx(auVar87,auVar228);
    auVar89 = vpermt2ps_avx512vl(auVar87,_DAT_0205fd20,auVar92);
    auVar97 = vpermt2ps_avx512vl(auVar109,_DAT_0205fd20,auVar92);
    auVar98 = vpermt2ps_avx512vl(auVar277,_DAT_0205fd20,auVar92);
    auVar111 = ZEXT1632(auVar80);
    auVar99 = vpermt2ps_avx512vl(auVar110,_DAT_0205fd20,auVar111);
    auVar87 = vpermt2ps_avx512vl(auVar242,_DAT_0205fd20,auVar111);
    auVar100 = vsubps_avx512vl(auVar89,auVar87);
    auVar87 = vsubps_avx(auVar94,ZEXT1632(auVar79));
    auVar92 = vsubps_avx(auVar95,ZEXT1632(auVar73));
    auVar90 = vsubps_avx(auVar96,auVar91);
    auVar237 = ZEXT3264(auVar90);
    auVar88 = vmulps_avx512vl(auVar92,auVar110);
    auVar88 = vfmsub231ps_avx512vl(auVar88,auVar277,auVar90);
    auVar101 = vmulps_avx512vl(auVar90,auVar109);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar110,auVar87);
    auVar102 = vmulps_avx512vl(auVar87,auVar277);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar109,auVar92);
    auVar102 = vmulps_avx512vl(auVar102,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar101);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar88,auVar88);
    auVar88 = vmulps_avx512vl(auVar90,auVar90);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar92,auVar92);
    auVar102 = vfmadd231ps_avx512vl(auVar88,auVar87,auVar87);
    auVar103 = vrcp14ps_avx512vl(auVar102);
    auVar88._8_4_ = 0x3f800000;
    auVar88._0_8_ = &DAT_3f8000003f800000;
    auVar88._12_4_ = 0x3f800000;
    auVar88._16_4_ = 0x3f800000;
    auVar88._20_4_ = 0x3f800000;
    auVar88._24_4_ = 0x3f800000;
    auVar88._28_4_ = 0x3f800000;
    auVar88 = vfnmadd213ps_avx512vl(auVar103,auVar102,auVar88);
    auVar88 = vfmadd132ps_avx512vl(auVar88,auVar103,auVar103);
    auVar101 = vmulps_avx512vl(auVar101,auVar88);
    auVar103 = vmulps_avx512vl(auVar92,auVar99);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar98,auVar90);
    auVar104 = vmulps_avx512vl(auVar90,auVar97);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar99,auVar87);
    auVar105 = vmulps_avx512vl(auVar87,auVar98);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar97,auVar92);
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar88 = vmulps_avx512vl(auVar103,auVar88);
    auVar88 = vmaxps_avx512vl(auVar101,auVar88);
    auVar88 = vsqrtps_avx512vl(auVar88);
    auVar101 = vmaxps_avx512vl(auVar100,auVar89);
    auVar93 = vmaxps_avx512vl(auVar93,auVar101);
    auVar101 = vaddps_avx512vl(auVar88,auVar93);
    auVar93 = vminps_avx512vl(auVar100,auVar89);
    auVar93 = vminps_avx(auVar86,auVar93);
    auVar93 = vsubps_avx512vl(auVar93,auVar88);
    auVar89._8_4_ = 0x3f800002;
    auVar89._0_8_ = 0x3f8000023f800002;
    auVar89._12_4_ = 0x3f800002;
    auVar89._16_4_ = 0x3f800002;
    auVar89._20_4_ = 0x3f800002;
    auVar89._24_4_ = 0x3f800002;
    auVar89._28_4_ = 0x3f800002;
    auVar86 = vmulps_avx512vl(auVar101,auVar89);
    auVar100._8_4_ = 0x3f7ffffc;
    auVar100._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar100._12_4_ = 0x3f7ffffc;
    auVar100._16_4_ = 0x3f7ffffc;
    auVar100._20_4_ = 0x3f7ffffc;
    auVar100._24_4_ = 0x3f7ffffc;
    auVar100._28_4_ = 0x3f7ffffc;
    local_720 = vmulps_avx512vl(auVar93,auVar100);
    auVar104._4_4_ = auVar86._4_4_ * auVar86._4_4_;
    auVar104._0_4_ = auVar86._0_4_ * auVar86._0_4_;
    auVar104._8_4_ = auVar86._8_4_ * auVar86._8_4_;
    auVar104._12_4_ = auVar86._12_4_ * auVar86._12_4_;
    auVar104._16_4_ = auVar86._16_4_ * auVar86._16_4_;
    auVar104._20_4_ = auVar86._20_4_ * auVar86._20_4_;
    auVar104._24_4_ = auVar86._24_4_ * auVar86._24_4_;
    auVar104._28_4_ = local_720._28_4_;
    auVar93 = vrsqrt14ps_avx512vl(auVar102);
    auVar101._8_4_ = 0xbf000000;
    auVar101._0_8_ = 0xbf000000bf000000;
    auVar101._12_4_ = 0xbf000000;
    auVar101._16_4_ = 0xbf000000;
    auVar101._20_4_ = 0xbf000000;
    auVar101._24_4_ = 0xbf000000;
    auVar101._28_4_ = 0xbf000000;
    auVar86 = vmulps_avx512vl(auVar102,auVar101);
    auVar105._4_4_ = auVar93._4_4_ * auVar86._4_4_;
    auVar105._0_4_ = auVar93._0_4_ * auVar86._0_4_;
    auVar105._8_4_ = auVar93._8_4_ * auVar86._8_4_;
    auVar105._12_4_ = auVar93._12_4_ * auVar86._12_4_;
    auVar105._16_4_ = auVar93._16_4_ * auVar86._16_4_;
    auVar105._20_4_ = auVar93._20_4_ * auVar86._20_4_;
    auVar105._24_4_ = auVar93._24_4_ * auVar86._24_4_;
    auVar105._28_4_ = auVar86._28_4_;
    auVar86 = vmulps_avx512vl(auVar93,auVar93);
    auVar86 = vmulps_avx512vl(auVar86,auVar105);
    auVar102._8_4_ = 0x3fc00000;
    auVar102._0_8_ = 0x3fc000003fc00000;
    auVar102._12_4_ = 0x3fc00000;
    auVar102._16_4_ = 0x3fc00000;
    auVar102._20_4_ = 0x3fc00000;
    auVar102._24_4_ = 0x3fc00000;
    auVar102._28_4_ = 0x3fc00000;
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar93,auVar102);
    auVar106._4_4_ = auVar86._4_4_ * auVar87._4_4_;
    auVar106._0_4_ = auVar86._0_4_ * auVar87._0_4_;
    auVar106._8_4_ = auVar86._8_4_ * auVar87._8_4_;
    auVar106._12_4_ = auVar86._12_4_ * auVar87._12_4_;
    auVar106._16_4_ = auVar86._16_4_ * auVar87._16_4_;
    auVar106._20_4_ = auVar86._20_4_ * auVar87._20_4_;
    auVar106._24_4_ = auVar86._24_4_ * auVar87._24_4_;
    auVar106._28_4_ = auVar93._28_4_;
    auVar93 = vmulps_avx512vl(auVar92,auVar86);
    auVar88 = vmulps_avx512vl(auVar90,auVar86);
    auVar203 = ZEXT1632(auVar79);
    auVar89 = vsubps_avx512vl(auVar111,auVar203);
    auVar185 = ZEXT1632(auVar73);
    auVar100 = vsubps_avx512vl(auVar111,auVar185);
    auVar101 = vsubps_avx512vl(auVar111,auVar91);
    auVar107._4_4_ = uStack_55c;
    auVar107._0_4_ = local_560;
    auVar107._8_4_ = uStack_558;
    auVar107._12_4_ = uStack_554;
    auVar107._16_4_ = uStack_550;
    auVar107._20_4_ = uStack_54c;
    auVar107._24_4_ = uStack_548;
    auVar107._28_4_ = uStack_544;
    auVar102 = vmulps_avx512vl(auVar107,auVar101);
    auVar102 = vfmadd231ps_avx512vl(auVar102,local_540,auVar100);
    auVar102 = vfmadd231ps_avx512vl(auVar102,local_520,auVar89);
    auVar103 = vmulps_avx512vl(auVar101,auVar101);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar100,auVar100);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar89,auVar89);
    auVar105 = vmulps_avx512vl(auVar107,auVar88);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar93,local_540);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar106,local_520);
    auVar88 = vmulps_avx512vl(auVar101,auVar88);
    auVar93 = vfmadd231ps_avx512vl(auVar88,auVar100,auVar93);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,auVar106);
    local_7c0 = vmulps_avx512vl(auVar105,auVar105);
    auVar88 = vsubps_avx512vl(local_3a0,local_7c0);
    auVar106 = vmulps_avx512vl(auVar105,auVar93);
    auVar102 = vsubps_avx512vl(auVar102,auVar106);
    auVar102 = vaddps_avx512vl(auVar102,auVar102);
    auVar106 = vmulps_avx512vl(auVar93,auVar93);
    local_660 = vsubps_avx512vl(auVar103,auVar106);
    auVar103 = vsubps_avx512vl(local_660,auVar104);
    local_740 = vmulps_avx512vl(auVar102,auVar102);
    fVar135 = auVar88._0_4_;
    fVar137 = auVar88._4_4_;
    local_880._4_4_ = fVar137 * 4.0;
    local_880._0_4_ = fVar135 * 4.0;
    fVar159 = auVar88._8_4_;
    local_880._8_4_ = fVar159 * 4.0;
    fVar138 = auVar88._12_4_;
    local_880._12_4_ = fVar138 * 4.0;
    fVar165 = auVar88._16_4_;
    local_880._16_4_ = fVar165 * 4.0;
    fVar244 = auVar88._20_4_;
    local_880._20_4_ = fVar244 * 4.0;
    fVar263 = auVar88._24_4_;
    local_880._24_4_ = fVar263 * 4.0;
    local_880._28_4_ = 0x40800000;
    auVar104 = vmulps_avx512vl(local_880,auVar103);
    auVar104 = vsubps_avx512vl(local_740,auVar104);
    uVar69 = vcmpps_avx512vl(auVar104,auVar111,5);
    bVar64 = (byte)uVar69;
    if (bVar64 == 0) {
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      in_ZMM31 = ZEXT3264(auVar85);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar104 = vsqrtps_avx512vl(auVar104);
      auVar106 = vaddps_avx512vl(auVar88,auVar88);
      auVar107 = vrcp14ps_avx512vl(auVar106);
      auVar34._8_4_ = 0x3f800000;
      auVar34._0_8_ = &DAT_3f8000003f800000;
      auVar34._12_4_ = 0x3f800000;
      auVar34._16_4_ = 0x3f800000;
      auVar34._20_4_ = 0x3f800000;
      auVar34._24_4_ = 0x3f800000;
      auVar34._28_4_ = 0x3f800000;
      auVar106 = vfnmadd213ps_avx512vl(auVar106,auVar107,auVar34);
      auVar106 = vfmadd132ps_avx512vl(auVar106,auVar107,auVar107);
      auVar85 = vxorps_avx512vl(auVar102,auVar85);
      auVar85 = vsubps_avx512vl(auVar85,auVar104);
      auVar85 = vmulps_avx512vl(auVar85,auVar106);
      auVar104 = vsubps_avx512vl(auVar104,auVar102);
      auVar104 = vmulps_avx512vl(auVar104,auVar106);
      auVar106 = vfmadd213ps_avx512vl(auVar105,auVar85,auVar93);
      local_4c0 = vmulps_avx512vl(auVar86,auVar106);
      auVar106 = vfmadd213ps_avx512vl(auVar105,auVar104,auVar93);
      local_4e0 = vmulps_avx512vl(auVar86,auVar106);
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar85 = vblendmps_avx512vl(auVar106,auVar85);
      uVar70 = (uint)(bVar64 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar64 & 1) * local_4e0._0_4_;
      bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
      uVar121 = (uint)bVar14 * auVar85._4_4_ | (uint)!bVar14 * local_4e0._4_4_;
      bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
      uVar123 = (uint)bVar14 * auVar85._8_4_ | (uint)!bVar14 * local_4e0._8_4_;
      bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
      uVar125 = (uint)bVar14 * auVar85._12_4_ | (uint)!bVar14 * local_4e0._12_4_;
      bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
      uVar127 = (uint)bVar14 * auVar85._16_4_ | (uint)!bVar14 * local_4e0._16_4_;
      bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
      uVar129 = (uint)bVar14 * auVar85._20_4_ | (uint)!bVar14 * local_4e0._20_4_;
      bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
      uVar131 = (uint)bVar14 * auVar85._24_4_ | (uint)!bVar14 * local_4e0._24_4_;
      bVar14 = SUB81(uVar69 >> 7,0);
      uVar133 = (uint)bVar14 * auVar85._28_4_ | (uint)!bVar14 * local_4e0._28_4_;
      in_ZMM31 = ZEXT3264(CONCAT428(uVar133,CONCAT424(uVar131,CONCAT420(uVar129,CONCAT416(uVar127,
                                                  CONCAT412(uVar125,CONCAT48(uVar123,CONCAT44(
                                                  uVar121,uVar70))))))));
      auVar216._8_4_ = 0xff800000;
      auVar216._0_8_ = 0xff800000ff800000;
      auVar216._12_4_ = 0xff800000;
      auVar216._16_4_ = 0xff800000;
      auVar216._20_4_ = 0xff800000;
      auVar216._24_4_ = 0xff800000;
      auVar216._28_4_ = 0xff800000;
      auVar85 = vblendmps_avx512vl(auVar216,auVar104);
      auVar108._0_4_ =
           (uint)(bVar64 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar104._0_4_;
      bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar108._4_4_ = (uint)bVar14 * auVar85._4_4_ | (uint)!bVar14 * auVar104._4_4_;
      bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar108._8_4_ = (uint)bVar14 * auVar85._8_4_ | (uint)!bVar14 * auVar104._8_4_;
      bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar108._12_4_ = (uint)bVar14 * auVar85._12_4_ | (uint)!bVar14 * auVar104._12_4_;
      bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar108._16_4_ = (uint)bVar14 * auVar85._16_4_ | (uint)!bVar14 * auVar104._16_4_;
      bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar108._20_4_ = (uint)bVar14 * auVar85._20_4_ | (uint)!bVar14 * auVar104._20_4_;
      bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar108._24_4_ = (uint)bVar14 * auVar85._24_4_ | (uint)!bVar14 * auVar104._24_4_;
      bVar14 = SUB81(uVar69 >> 7,0);
      auVar108._28_4_ = (uint)bVar14 * auVar85._28_4_ | (uint)!bVar14 * auVar104._28_4_;
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_7c0,auVar85);
      auVar104 = vmaxps_avx512vl(local_460,auVar85);
      auVar35._8_4_ = 0x36000000;
      auVar35._0_8_ = 0x3600000036000000;
      auVar35._12_4_ = 0x36000000;
      auVar35._16_4_ = 0x36000000;
      auVar35._20_4_ = 0x36000000;
      auVar35._24_4_ = 0x36000000;
      auVar35._28_4_ = 0x36000000;
      auVar104 = vmulps_avx512vl(auVar104,auVar35);
      vandps_avx512vl(auVar88,auVar85);
      uVar62 = vcmpps_avx512vl(auVar104,auVar104,1);
      uVar69 = uVar69 & uVar62;
      bVar65 = (byte)uVar69;
      if (bVar65 != 0) {
        uVar62 = vcmpps_avx512vl(auVar103,_DAT_02020f00,2);
        auVar229._8_4_ = 0xff800000;
        auVar229._0_8_ = 0xff800000ff800000;
        auVar229._12_4_ = 0xff800000;
        auVar229._16_4_ = 0xff800000;
        auVar229._20_4_ = 0xff800000;
        auVar229._24_4_ = 0xff800000;
        auVar229._28_4_ = 0xff800000;
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar103 = vblendmps_avx512vl(auVar85,auVar229);
        bVar63 = (byte)uVar62;
        uVar71 = (uint)(bVar63 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar104._0_4_;
        bVar14 = (bool)((byte)(uVar62 >> 1) & 1);
        uVar122 = (uint)bVar14 * auVar103._4_4_ | (uint)!bVar14 * auVar104._4_4_;
        bVar14 = (bool)((byte)(uVar62 >> 2) & 1);
        uVar124 = (uint)bVar14 * auVar103._8_4_ | (uint)!bVar14 * auVar104._8_4_;
        bVar14 = (bool)((byte)(uVar62 >> 3) & 1);
        uVar126 = (uint)bVar14 * auVar103._12_4_ | (uint)!bVar14 * auVar104._12_4_;
        bVar14 = (bool)((byte)(uVar62 >> 4) & 1);
        uVar128 = (uint)bVar14 * auVar103._16_4_ | (uint)!bVar14 * auVar104._16_4_;
        bVar14 = (bool)((byte)(uVar62 >> 5) & 1);
        uVar130 = (uint)bVar14 * auVar103._20_4_ | (uint)!bVar14 * auVar104._20_4_;
        bVar14 = (bool)((byte)(uVar62 >> 6) & 1);
        uVar132 = (uint)bVar14 * auVar103._24_4_ | (uint)!bVar14 * auVar104._24_4_;
        bVar14 = SUB81(uVar62 >> 7,0);
        uVar134 = (uint)bVar14 * auVar103._28_4_ | (uint)!bVar14 * auVar104._28_4_;
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar69 >> 4) & 1);
        bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
        bVar18 = (bool)((byte)(uVar69 >> 6) & 1);
        bVar19 = SUB81(uVar69 >> 7,0);
        in_ZMM31 = ZEXT3264(CONCAT428(bVar19 * uVar134 | !bVar19 * uVar133,
                                      CONCAT424(bVar18 * uVar132 | !bVar18 * uVar131,
                                                CONCAT420(bVar17 * uVar130 | !bVar17 * uVar129,
                                                          CONCAT416(bVar16 * uVar128 |
                                                                    !bVar16 * uVar127,
                                                                    CONCAT412(bVar15 * uVar126 |
                                                                              !bVar15 * uVar125,
                                                                              CONCAT48(bVar68 * 
                                                  uVar124 | !bVar68 * uVar123,
                                                  CONCAT44(bVar14 * uVar122 | !bVar14 * uVar121,
                                                           (bVar65 & 1) * uVar71 |
                                                           !(bool)(bVar65 & 1) * uVar70))))))));
        auVar85 = vblendmps_avx512vl(auVar229,auVar85);
        bVar14 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar62 >> 3) & 1);
        bVar17 = (bool)((byte)(uVar62 >> 4) & 1);
        bVar18 = (bool)((byte)(uVar62 >> 5) & 1);
        bVar19 = (bool)((byte)(uVar62 >> 6) & 1);
        bVar20 = SUB81(uVar62 >> 7,0);
        auVar108._0_4_ =
             (uint)(bVar65 & 1) *
             ((uint)(bVar63 & 1) * auVar85._0_4_ | !(bool)(bVar63 & 1) * uVar71) |
             !(bool)(bVar65 & 1) * auVar108._0_4_;
        bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar108._4_4_ =
             (uint)bVar68 * ((uint)bVar14 * auVar85._4_4_ | !bVar14 * uVar122) |
             !bVar68 * auVar108._4_4_;
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar108._8_4_ =
             (uint)bVar14 * ((uint)bVar15 * auVar85._8_4_ | !bVar15 * uVar124) |
             !bVar14 * auVar108._8_4_;
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar108._12_4_ =
             (uint)bVar14 * ((uint)bVar16 * auVar85._12_4_ | !bVar16 * uVar126) |
             !bVar14 * auVar108._12_4_;
        bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar108._16_4_ =
             (uint)bVar14 * ((uint)bVar17 * auVar85._16_4_ | !bVar17 * uVar128) |
             !bVar14 * auVar108._16_4_;
        bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar108._20_4_ =
             (uint)bVar14 * ((uint)bVar18 * auVar85._20_4_ | !bVar18 * uVar130) |
             !bVar14 * auVar108._20_4_;
        bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar108._24_4_ =
             (uint)bVar14 * ((uint)bVar19 * auVar85._24_4_ | !bVar19 * uVar132) |
             !bVar14 * auVar108._24_4_;
        bVar14 = SUB81(uVar69 >> 7,0);
        auVar108._28_4_ =
             (uint)bVar14 * ((uint)bVar20 * auVar85._28_4_ | !bVar20 * uVar134) |
             !bVar14 * auVar108._28_4_;
        bVar64 = (~bVar65 | bVar63) & bVar64;
      }
    }
    if ((bVar64 & 0x7f) == 0) {
LAB_01c2e637:
      auVar273 = ZEXT3264(auVar109);
      auVar257 = ZEXT3264(auVar95);
      auVar279 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar265 = ZEXT3264(_DAT_02020f20);
    }
    else {
      auVar80 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_620);
      auVar217._0_4_ = auVar80._0_4_;
      auVar217._4_4_ = auVar217._0_4_;
      auVar217._8_4_ = auVar217._0_4_;
      auVar217._12_4_ = auVar217._0_4_;
      auVar217._16_4_ = auVar217._0_4_;
      auVar217._20_4_ = auVar217._0_4_;
      auVar217._24_4_ = auVar217._0_4_;
      auVar217._28_4_ = auVar217._0_4_;
      auVar85 = vmaxps_avx512vl(auVar217,in_ZMM31._0_32_);
      auVar80 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_620);
      auVar230._0_4_ = auVar80._0_4_;
      auVar230._4_4_ = auVar230._0_4_;
      auVar230._8_4_ = auVar230._0_4_;
      auVar230._12_4_ = auVar230._0_4_;
      auVar230._16_4_ = auVar230._0_4_;
      auVar230._20_4_ = auVar230._0_4_;
      auVar230._24_4_ = auVar230._0_4_;
      auVar230._28_4_ = auVar230._0_4_;
      auVar103 = vminps_avx512vl(auVar230,auVar108);
      auVar101 = vmulps_avx512vl(auVar110,auVar101);
      auVar100 = vfmadd213ps_avx512vl(auVar100,auVar277,auVar101);
      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar109,auVar100);
      auVar57._4_4_ = uStack_55c;
      auVar57._0_4_ = local_560;
      auVar57._8_4_ = uStack_558;
      auVar57._12_4_ = uStack_554;
      auVar57._16_4_ = uStack_550;
      auVar57._20_4_ = uStack_54c;
      auVar57._24_4_ = uStack_548;
      auVar57._28_4_ = uStack_544;
      auVar100 = vmulps_avx512vl(auVar57,auVar110);
      auVar100 = vfmadd231ps_avx512vl(auVar100,local_540,auVar277);
      in_ZMM31 = ZEXT3264(local_520);
      auVar100 = vfmadd231ps_avx512vl(auVar100,local_520,auVar109);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar100,auVar101);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar23 = vcmpps_avx512vl(auVar101,auVar109,1);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar89 = vxorps_avx512vl(auVar89,auVar110);
      auVar104 = vrcp14ps_avx512vl(auVar100);
      auVar106 = vxorps_avx512vl(auVar100,auVar110);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar111 = vfnmadd213ps_avx512vl(auVar104,auVar100,auVar107);
      auVar111 = vfmadd132ps_avx512vl(auVar111,auVar104,auVar104);
      auVar89 = vmulps_avx512vl(auVar111,auVar89);
      uVar24 = vcmpps_avx512vl(auVar100,auVar106,1);
      bVar65 = (byte)uVar23 | (byte)uVar24;
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar112 = vblendmps_avx512vl(auVar89,auVar111);
      auVar113._0_4_ =
           (uint)(bVar65 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar104._0_4_;
      bVar14 = (bool)(bVar65 >> 1 & 1);
      auVar113._4_4_ = (uint)bVar14 * auVar112._4_4_ | (uint)!bVar14 * auVar104._4_4_;
      bVar14 = (bool)(bVar65 >> 2 & 1);
      auVar113._8_4_ = (uint)bVar14 * auVar112._8_4_ | (uint)!bVar14 * auVar104._8_4_;
      bVar14 = (bool)(bVar65 >> 3 & 1);
      auVar113._12_4_ = (uint)bVar14 * auVar112._12_4_ | (uint)!bVar14 * auVar104._12_4_;
      bVar14 = (bool)(bVar65 >> 4 & 1);
      auVar113._16_4_ = (uint)bVar14 * auVar112._16_4_ | (uint)!bVar14 * auVar104._16_4_;
      bVar14 = (bool)(bVar65 >> 5 & 1);
      auVar113._20_4_ = (uint)bVar14 * auVar112._20_4_ | (uint)!bVar14 * auVar104._20_4_;
      bVar14 = (bool)(bVar65 >> 6 & 1);
      auVar113._24_4_ = (uint)bVar14 * auVar112._24_4_ | (uint)!bVar14 * auVar104._24_4_;
      auVar113._28_4_ =
           (uint)(bVar65 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar104._28_4_;
      auVar85 = vmaxps_avx(auVar85,auVar113);
      uVar24 = vcmpps_avx512vl(auVar100,auVar106,6);
      bVar65 = (byte)uVar23 | (byte)uVar24;
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114._0_4_ =
           (uint)(bVar65 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar89._0_4_;
      bVar14 = (bool)(bVar65 >> 1 & 1);
      auVar114._4_4_ = (uint)bVar14 * auVar100._4_4_ | (uint)!bVar14 * auVar89._4_4_;
      bVar14 = (bool)(bVar65 >> 2 & 1);
      auVar114._8_4_ = (uint)bVar14 * auVar100._8_4_ | (uint)!bVar14 * auVar89._8_4_;
      bVar14 = (bool)(bVar65 >> 3 & 1);
      auVar114._12_4_ = (uint)bVar14 * auVar100._12_4_ | (uint)!bVar14 * auVar89._12_4_;
      bVar14 = (bool)(bVar65 >> 4 & 1);
      auVar114._16_4_ = (uint)bVar14 * auVar100._16_4_ | (uint)!bVar14 * auVar89._16_4_;
      bVar14 = (bool)(bVar65 >> 5 & 1);
      auVar114._20_4_ = (uint)bVar14 * auVar100._20_4_ | (uint)!bVar14 * auVar89._20_4_;
      bVar14 = (bool)(bVar65 >> 6 & 1);
      auVar114._24_4_ = (uint)bVar14 * auVar100._24_4_ | (uint)!bVar14 * auVar89._24_4_;
      auVar114._28_4_ =
           (uint)(bVar65 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar89._28_4_;
      auVar89 = vminps_avx(auVar103,auVar114);
      auVar73 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
      auVar94 = vsubps_avx512vl(ZEXT1632(auVar73),auVar94);
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar73),auVar95);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar73),auVar96);
      auVar96 = vmulps_avx512vl(auVar96,auVar99);
      auVar96 = vfnmsub231ps_avx512vl(auVar96,auVar98,auVar103);
      auVar94 = vfnmadd231ps_avx512vl(auVar96,auVar97,auVar94);
      auVar96 = vmulps_avx512vl(auVar57,auVar99);
      auVar96 = vfnmsub231ps_avx512vl(auVar96,local_540,auVar98);
      auVar96 = vfnmadd231ps_avx512vl(auVar96,local_520,auVar97);
      vandps_avx512vl(auVar96,auVar101);
      uVar23 = vcmpps_avx512vl(auVar96,auVar109,1);
      auVar101 = vxorps_avx512vl(auVar94,auVar110);
      auVar94 = vrcp14ps_avx512vl(auVar96);
      auVar109 = vxorps_avx512vl(auVar96,auVar110);
      auVar80 = vfnmadd213ps_fma(auVar94,auVar96,auVar107);
      auVar80 = vfmadd132ps_fma(ZEXT1632(auVar80),auVar94,auVar94);
      auVar278 = ZEXT1664(auVar80);
      fVar256 = auVar80._0_4_ * auVar101._0_4_;
      fVar258 = auVar80._4_4_ * auVar101._4_4_;
      auVar43._4_4_ = fVar258;
      auVar43._0_4_ = fVar256;
      fVar259 = auVar80._8_4_ * auVar101._8_4_;
      auVar43._8_4_ = fVar259;
      fVar260 = auVar80._12_4_ * auVar101._12_4_;
      auVar43._12_4_ = fVar260;
      fVar261 = auVar101._16_4_ * 0.0;
      auVar43._16_4_ = fVar261;
      fVar136 = auVar101._20_4_ * 0.0;
      auVar43._20_4_ = fVar136;
      fVar158 = auVar101._24_4_ * 0.0;
      auVar43._24_4_ = fVar158;
      auVar43._28_4_ = auVar101._28_4_;
      uVar24 = vcmpps_avx512vl(auVar96,auVar109,1);
      bVar65 = (byte)uVar23 | (byte)uVar24;
      auVar97 = vblendmps_avx512vl(auVar43,auVar111);
      auVar115._0_4_ =
           (uint)(bVar65 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar94._0_4_;
      bVar14 = (bool)(bVar65 >> 1 & 1);
      auVar115._4_4_ = (uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar94._4_4_;
      bVar14 = (bool)(bVar65 >> 2 & 1);
      auVar115._8_4_ = (uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar94._8_4_;
      bVar14 = (bool)(bVar65 >> 3 & 1);
      auVar115._12_4_ = (uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar94._12_4_;
      bVar14 = (bool)(bVar65 >> 4 & 1);
      auVar115._16_4_ = (uint)bVar14 * auVar97._16_4_ | (uint)!bVar14 * auVar94._16_4_;
      bVar14 = (bool)(bVar65 >> 5 & 1);
      auVar115._20_4_ = (uint)bVar14 * auVar97._20_4_ | (uint)!bVar14 * auVar94._20_4_;
      bVar14 = (bool)(bVar65 >> 6 & 1);
      auVar115._24_4_ = (uint)bVar14 * auVar97._24_4_ | (uint)!bVar14 * auVar94._24_4_;
      auVar115._28_4_ =
           (uint)(bVar65 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar94._28_4_;
      _local_5a0 = vmaxps_avx(auVar85,auVar115);
      uVar24 = vcmpps_avx512vl(auVar96,auVar109,6);
      bVar65 = (byte)uVar23 | (byte)uVar24;
      auVar95._0_4_ = (uint)(bVar65 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar65 & 1) * (int)fVar256
      ;
      bVar14 = (bool)(bVar65 >> 1 & 1);
      auVar95._4_4_ = (uint)bVar14 * auVar100._4_4_ | (uint)!bVar14 * (int)fVar258;
      bVar14 = (bool)(bVar65 >> 2 & 1);
      auVar95._8_4_ = (uint)bVar14 * auVar100._8_4_ | (uint)!bVar14 * (int)fVar259;
      bVar14 = (bool)(bVar65 >> 3 & 1);
      auVar95._12_4_ = (uint)bVar14 * auVar100._12_4_ | (uint)!bVar14 * (int)fVar260;
      bVar14 = (bool)(bVar65 >> 4 & 1);
      auVar95._16_4_ = (uint)bVar14 * auVar100._16_4_ | (uint)!bVar14 * (int)fVar261;
      bVar14 = (bool)(bVar65 >> 5 & 1);
      auVar95._20_4_ = (uint)bVar14 * auVar100._20_4_ | (uint)!bVar14 * (int)fVar136;
      bVar14 = (bool)(bVar65 >> 6 & 1);
      auVar95._24_4_ = (uint)bVar14 * auVar100._24_4_ | (uint)!bVar14 * (int)fVar158;
      auVar95._28_4_ =
           (uint)(bVar65 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar101._28_4_;
      local_3e0 = vminps_avx(auVar89,auVar95);
      auVar255 = ZEXT3264(local_3e0);
      auVar85 = _local_5a0;
      uVar23 = vcmpps_avx512vl(_local_5a0,local_3e0,2);
      bVar64 = bVar64 & 0x7f & (byte)uVar23;
      if (bVar64 == 0) goto LAB_01c2e637;
      auVar94 = vmaxps_avx512vl(ZEXT1632(auVar73),local_720);
      auVar89 = vminps_avx(local_4c0,auVar107);
      auVar52 = ZEXT412(0);
      auVar101 = ZEXT1232(auVar52) << 0x20;
      auVar89 = vmaxps_avx(auVar89,ZEXT1232(auVar52) << 0x20);
      auVar100 = vminps_avx(local_4e0,auVar107);
      auVar44._4_4_ = (auVar89._4_4_ + 1.0) * 0.125;
      auVar44._0_4_ = (auVar89._0_4_ + 0.0) * 0.125;
      auVar44._8_4_ = (auVar89._8_4_ + 2.0) * 0.125;
      auVar44._12_4_ = (auVar89._12_4_ + 3.0) * 0.125;
      auVar44._16_4_ = (auVar89._16_4_ + 4.0) * 0.125;
      auVar44._20_4_ = (auVar89._20_4_ + 5.0) * 0.125;
      auVar44._24_4_ = (auVar89._24_4_ + 6.0) * 0.125;
      auVar44._28_4_ = auVar89._28_4_ + 7.0;
      local_4c0 = vfmadd213ps_avx512vl(auVar44,local_8c0,local_860);
      auVar89 = vmaxps_avx(auVar100,ZEXT1232(auVar52) << 0x20);
      auVar45._4_4_ = (auVar89._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar89._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar89._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar89._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar89._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar89._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar89._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar89._28_4_ + 7.0;
      local_4e0 = vfmadd213ps_avx512vl(auVar45,local_8c0,local_860);
      auVar46._4_4_ = auVar94._4_4_ * auVar94._4_4_;
      auVar46._0_4_ = auVar94._0_4_ * auVar94._0_4_;
      auVar46._8_4_ = auVar94._8_4_ * auVar94._8_4_;
      auVar46._12_4_ = auVar94._12_4_ * auVar94._12_4_;
      auVar46._16_4_ = auVar94._16_4_ * auVar94._16_4_;
      auVar46._20_4_ = auVar94._20_4_ * auVar94._20_4_;
      auVar46._24_4_ = auVar94._24_4_ * auVar94._24_4_;
      auVar46._28_4_ = local_4e0._28_4_;
      auVar89 = vsubps_avx(local_660,auVar46);
      auVar47._4_4_ = auVar89._4_4_ * fVar137 * 4.0;
      auVar47._0_4_ = auVar89._0_4_ * fVar135 * 4.0;
      auVar47._8_4_ = auVar89._8_4_ * fVar159 * 4.0;
      auVar47._12_4_ = auVar89._12_4_ * fVar138 * 4.0;
      auVar47._16_4_ = auVar89._16_4_ * fVar165 * 4.0;
      auVar47._20_4_ = auVar89._20_4_ * fVar244 * 4.0;
      auVar47._24_4_ = auVar89._24_4_ * fVar263 * 4.0;
      auVar47._28_4_ = local_4e0._28_4_;
      auVar100 = vsubps_avx(local_740,auVar47);
      uVar23 = vcmpps_avx512vl(auVar100,ZEXT1232(auVar52) << 0x20,5);
      bVar65 = (byte)uVar23;
      auVar94 = SUB6432(ZEXT864(0),0) << 0x20;
      if (bVar65 == 0) {
        auVar93 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar265 = ZEXT864(0) << 0x20;
        auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar257 = ZEXT864(0) << 0x20;
        auVar116._8_4_ = 0x7f800000;
        auVar116._0_8_ = 0x7f8000007f800000;
        auVar116._12_4_ = 0x7f800000;
        auVar116._16_4_ = 0x7f800000;
        auVar116._20_4_ = 0x7f800000;
        auVar116._24_4_ = 0x7f800000;
        auVar116._28_4_ = 0x7f800000;
        auVar117._8_4_ = 0xff800000;
        auVar117._0_8_ = 0xff800000ff800000;
        auVar117._12_4_ = 0xff800000;
        auVar117._16_4_ = 0xff800000;
        auVar117._20_4_ = 0xff800000;
        auVar117._24_4_ = 0xff800000;
        auVar117._28_4_ = 0xff800000;
      }
      else {
        auVar73 = vxorps_avx512vl(local_7c0._0_16_,local_7c0._0_16_);
        uVar69 = vcmpps_avx512vl(auVar100,ZEXT832(0) << 0x20,5);
        auVar100 = vsqrtps_avx(auVar100);
        auVar231._0_4_ = fVar135 + fVar135;
        auVar231._4_4_ = fVar137 + fVar137;
        auVar231._8_4_ = fVar159 + fVar159;
        auVar231._12_4_ = fVar138 + fVar138;
        auVar231._16_4_ = fVar165 + fVar165;
        auVar231._20_4_ = fVar244 + fVar244;
        auVar231._24_4_ = fVar263 + fVar263;
        auVar231._28_4_ = auVar88._28_4_ + auVar88._28_4_;
        auVar101 = vrcp14ps_avx512vl(auVar231);
        auVar80 = vfnmadd213ps_fma(auVar231,auVar101,auVar107);
        auVar80 = vfmadd132ps_fma(ZEXT1632(auVar80),auVar101,auVar101);
        auVar36._8_4_ = 0x80000000;
        auVar36._0_8_ = 0x8000000080000000;
        auVar36._12_4_ = 0x80000000;
        auVar36._16_4_ = 0x80000000;
        auVar36._20_4_ = 0x80000000;
        auVar36._24_4_ = 0x80000000;
        auVar36._28_4_ = 0x80000000;
        auVar101 = vxorps_avx512vl(auVar102,auVar36);
        auVar101 = vsubps_avx(auVar101,auVar100);
        auVar48._4_4_ = auVar101._4_4_ * auVar80._4_4_;
        auVar48._0_4_ = auVar101._0_4_ * auVar80._0_4_;
        auVar48._8_4_ = auVar101._8_4_ * auVar80._8_4_;
        auVar48._12_4_ = auVar101._12_4_ * auVar80._12_4_;
        auVar48._16_4_ = auVar101._16_4_ * 0.0;
        auVar48._20_4_ = auVar101._20_4_ * 0.0;
        auVar48._24_4_ = auVar101._24_4_ * 0.0;
        auVar48._28_4_ = 0x3e000000;
        auVar100 = vsubps_avx512vl(auVar100,auVar102);
        auVar49._4_4_ = auVar100._4_4_ * auVar80._4_4_;
        auVar49._0_4_ = auVar100._0_4_ * auVar80._0_4_;
        auVar49._8_4_ = auVar100._8_4_ * auVar80._8_4_;
        auVar49._12_4_ = auVar100._12_4_ * auVar80._12_4_;
        auVar49._16_4_ = auVar100._16_4_ * 0.0;
        auVar49._20_4_ = auVar100._20_4_ * 0.0;
        auVar49._24_4_ = auVar100._24_4_ * 0.0;
        auVar49._28_4_ = auVar107._28_4_;
        auVar100 = vfmadd213ps_avx512vl(auVar105,auVar48,auVar93);
        auVar50._4_4_ = auVar86._4_4_ * auVar100._4_4_;
        auVar50._0_4_ = auVar86._0_4_ * auVar100._0_4_;
        auVar50._8_4_ = auVar86._8_4_ * auVar100._8_4_;
        auVar50._12_4_ = auVar86._12_4_ * auVar100._12_4_;
        auVar50._16_4_ = auVar86._16_4_ * auVar100._16_4_;
        auVar50._20_4_ = auVar86._20_4_ * auVar100._20_4_;
        auVar50._24_4_ = auVar86._24_4_ * auVar100._24_4_;
        auVar50._28_4_ = auVar101._28_4_;
        auVar100 = vmulps_avx512vl(local_520,auVar48);
        auVar101 = vmulps_avx512vl(local_540,auVar48);
        auVar58._4_4_ = uStack_55c;
        auVar58._0_4_ = local_560;
        auVar58._8_4_ = uStack_558;
        auVar58._12_4_ = uStack_554;
        auVar58._16_4_ = uStack_550;
        auVar58._20_4_ = uStack_54c;
        auVar58._24_4_ = uStack_548;
        auVar58._28_4_ = uStack_544;
        auVar102 = vmulps_avx512vl(auVar58,auVar48);
        auVar94 = vfmadd213ps_avx512vl(auVar87,auVar50,auVar203);
        auVar100 = vsubps_avx512vl(auVar100,auVar94);
        auVar94 = vfmadd213ps_avx512vl(auVar92,auVar50,auVar185);
        auVar94 = vsubps_avx512vl(auVar101,auVar94);
        auVar80 = vfmadd213ps_fma(auVar50,auVar90,auVar91);
        auVar101 = vsubps_avx(auVar102,ZEXT1632(auVar80));
        auVar257 = ZEXT3264(auVar101);
        auVar93 = vfmadd213ps_avx512vl(auVar105,auVar49,auVar93);
        auVar86 = vmulps_avx512vl(auVar86,auVar93);
        auVar93 = vmulps_avx512vl(local_520,auVar49);
        auVar102 = vmulps_avx512vl(local_540,auVar49);
        auVar96 = vmulps_avx512vl(auVar58,auVar49);
        auVar80 = vfmadd213ps_fma(auVar87,auVar86,auVar203);
        auVar101 = vsubps_avx(auVar93,ZEXT1632(auVar80));
        auVar80 = vfmadd213ps_fma(auVar92,auVar86,auVar185);
        auVar93 = vsubps_avx512vl(auVar102,ZEXT1632(auVar80));
        auVar80 = vfmadd213ps_fma(auVar90,auVar86,auVar91);
        auVar86 = vsubps_avx512vl(auVar96,ZEXT1632(auVar80));
        auVar265 = ZEXT3264(auVar86);
        auVar149._8_4_ = 0x7f800000;
        auVar149._0_8_ = 0x7f8000007f800000;
        auVar149._12_4_ = 0x7f800000;
        auVar149._16_4_ = 0x7f800000;
        auVar149._20_4_ = 0x7f800000;
        auVar149._24_4_ = 0x7f800000;
        auVar149._28_4_ = 0x7f800000;
        auVar86 = vblendmps_avx512vl(auVar149,auVar48);
        bVar14 = (bool)((byte)uVar69 & 1);
        auVar116._0_4_ = (uint)bVar14 * auVar86._0_4_ | (uint)!bVar14 * auVar79._0_4_;
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar14 * auVar86._4_4_ | (uint)!bVar14 * auVar79._4_4_;
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar14 * auVar86._8_4_ | (uint)!bVar14 * auVar79._8_4_;
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar14 * auVar86._12_4_ | (uint)!bVar14 * auVar79._12_4_;
        iVar1 = (uint)((byte)(uVar69 >> 4) & 1) * auVar86._16_4_;
        auVar116._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar69 >> 5) & 1) * auVar86._20_4_;
        auVar116._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar69 >> 6) & 1) * auVar86._24_4_;
        auVar116._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar69 >> 7) * auVar86._28_4_;
        auVar116._28_4_ = iVar4;
        auVar150._8_4_ = 0xff800000;
        auVar150._0_8_ = 0xff800000ff800000;
        auVar150._12_4_ = 0xff800000;
        auVar150._16_4_ = 0xff800000;
        auVar150._20_4_ = 0xff800000;
        auVar150._24_4_ = 0xff800000;
        auVar150._28_4_ = 0xff800000;
        auVar86 = vblendmps_avx512vl(auVar150,auVar49);
        bVar14 = (bool)((byte)uVar69 & 1);
        auVar117._0_4_ = (uint)bVar14 * auVar86._0_4_ | (uint)!bVar14 * -0x800000;
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar14 * auVar86._4_4_ | (uint)!bVar14 * -0x800000;
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar14 * auVar86._8_4_ | (uint)!bVar14 * -0x800000;
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar14 * auVar86._12_4_ | (uint)!bVar14 * -0x800000;
        bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar117._16_4_ = (uint)bVar14 * auVar86._16_4_ | (uint)!bVar14 * -0x800000;
        bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar117._20_4_ = (uint)bVar14 * auVar86._20_4_ | (uint)!bVar14 * -0x800000;
        bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar117._24_4_ = (uint)bVar14 * auVar86._24_4_ | (uint)!bVar14 * -0x800000;
        bVar14 = SUB81(uVar69 >> 7,0);
        auVar117._28_4_ = (uint)bVar14 * auVar86._28_4_ | (uint)!bVar14 * -0x800000;
        auVar248._8_4_ = 0x7fffffff;
        auVar248._0_8_ = 0x7fffffff7fffffff;
        auVar248._12_4_ = 0x7fffffff;
        auVar248._16_4_ = 0x7fffffff;
        auVar248._20_4_ = 0x7fffffff;
        auVar248._24_4_ = 0x7fffffff;
        auVar248._28_4_ = 0x7fffffff;
        auVar86 = vandps_avx(auVar248,local_7c0);
        auVar86 = vmaxps_avx(local_460,auVar86);
        auVar37._8_4_ = 0x36000000;
        auVar37._0_8_ = 0x3600000036000000;
        auVar37._12_4_ = 0x36000000;
        auVar37._16_4_ = 0x36000000;
        auVar37._20_4_ = 0x36000000;
        auVar37._24_4_ = 0x36000000;
        auVar37._28_4_ = 0x36000000;
        auVar87 = vmulps_avx512vl(auVar86,auVar37);
        auVar86 = vandps_avx(auVar88,auVar248);
        uVar62 = vcmpps_avx512vl(auVar86,auVar87,1);
        uVar69 = uVar69 & uVar62;
        bVar63 = (byte)uVar69;
        if (bVar63 != 0) {
          uVar62 = vcmpps_avx512vl(auVar89,ZEXT1632(auVar73),2);
          auVar249._8_4_ = 0xff800000;
          auVar249._0_8_ = 0xff800000ff800000;
          auVar249._12_4_ = 0xff800000;
          auVar249._16_4_ = 0xff800000;
          auVar249._20_4_ = 0xff800000;
          auVar249._24_4_ = 0xff800000;
          auVar249._28_4_ = 0xff800000;
          auVar272._8_4_ = 0x7f800000;
          auVar272._0_8_ = 0x7f8000007f800000;
          auVar272._12_4_ = 0x7f800000;
          auVar272._16_4_ = 0x7f800000;
          auVar272._20_4_ = 0x7f800000;
          auVar272._24_4_ = 0x7f800000;
          auVar272._28_4_ = 0x7f800000;
          auVar86 = vblendmps_avx512vl(auVar272,auVar249);
          bVar61 = (byte)uVar62;
          uVar70 = (uint)(bVar61 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar87._0_4_;
          bVar14 = (bool)((byte)(uVar62 >> 1) & 1);
          uVar121 = (uint)bVar14 * auVar86._4_4_ | (uint)!bVar14 * auVar87._4_4_;
          bVar14 = (bool)((byte)(uVar62 >> 2) & 1);
          uVar123 = (uint)bVar14 * auVar86._8_4_ | (uint)!bVar14 * auVar87._8_4_;
          bVar14 = (bool)((byte)(uVar62 >> 3) & 1);
          uVar125 = (uint)bVar14 * auVar86._12_4_ | (uint)!bVar14 * auVar87._12_4_;
          bVar14 = (bool)((byte)(uVar62 >> 4) & 1);
          uVar127 = (uint)bVar14 * auVar86._16_4_ | (uint)!bVar14 * auVar87._16_4_;
          bVar14 = (bool)((byte)(uVar62 >> 5) & 1);
          uVar129 = (uint)bVar14 * auVar86._20_4_ | (uint)!bVar14 * auVar87._20_4_;
          bVar14 = (bool)((byte)(uVar62 >> 6) & 1);
          uVar131 = (uint)bVar14 * auVar86._24_4_ | (uint)!bVar14 * auVar87._24_4_;
          bVar14 = SUB81(uVar62 >> 7,0);
          uVar133 = (uint)bVar14 * auVar86._28_4_ | (uint)!bVar14 * auVar87._28_4_;
          auVar116._0_4_ = (bVar63 & 1) * uVar70 | !(bool)(bVar63 & 1) * auVar116._0_4_;
          bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar116._4_4_ = bVar14 * uVar121 | !bVar14 * auVar116._4_4_;
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar116._8_4_ = bVar14 * uVar123 | !bVar14 * auVar116._8_4_;
          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar116._12_4_ = bVar14 * uVar125 | !bVar14 * auVar116._12_4_;
          bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar116._16_4_ = bVar14 * uVar127 | (uint)!bVar14 * iVar1;
          bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar116._20_4_ = bVar14 * uVar129 | (uint)!bVar14 * iVar2;
          bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar116._24_4_ = bVar14 * uVar131 | (uint)!bVar14 * iVar3;
          bVar14 = SUB81(uVar69 >> 7,0);
          auVar116._28_4_ = bVar14 * uVar133 | (uint)!bVar14 * iVar4;
          auVar86 = vblendmps_avx512vl(auVar249,auVar272);
          bVar14 = (bool)((byte)(uVar62 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar62 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar62 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar62 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar62 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar62 >> 6) & 1);
          bVar20 = SUB81(uVar62 >> 7,0);
          auVar117._0_4_ =
               (uint)(bVar63 & 1) *
               ((uint)(bVar61 & 1) * auVar86._0_4_ | !(bool)(bVar61 & 1) * uVar70) |
               !(bool)(bVar63 & 1) * auVar117._0_4_;
          bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar117._4_4_ =
               (uint)bVar68 * ((uint)bVar14 * auVar86._4_4_ | !bVar14 * uVar121) |
               !bVar68 * auVar117._4_4_;
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar117._8_4_ =
               (uint)bVar14 * ((uint)bVar15 * auVar86._8_4_ | !bVar15 * uVar123) |
               !bVar14 * auVar117._8_4_;
          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar117._12_4_ =
               (uint)bVar14 * ((uint)bVar16 * auVar86._12_4_ | !bVar16 * uVar125) |
               !bVar14 * auVar117._12_4_;
          bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar117._16_4_ =
               (uint)bVar14 * ((uint)bVar17 * auVar86._16_4_ | !bVar17 * uVar127) |
               !bVar14 * auVar117._16_4_;
          bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar117._20_4_ =
               (uint)bVar14 * ((uint)bVar18 * auVar86._20_4_ | !bVar18 * uVar129) |
               !bVar14 * auVar117._20_4_;
          bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar117._24_4_ =
               (uint)bVar14 * ((uint)bVar19 * auVar86._24_4_ | !bVar19 * uVar131) |
               !bVar14 * auVar117._24_4_;
          bVar14 = SUB81(uVar69 >> 7,0);
          auVar117._28_4_ =
               (uint)bVar14 * ((uint)bVar20 * auVar86._28_4_ | !bVar20 * uVar133) |
               !bVar14 * auVar117._28_4_;
          bVar65 = (~bVar63 | bVar61) & bVar65;
        }
      }
      auVar275._8_4_ = 0x7fffffff;
      auVar275._0_8_ = 0x7fffffff7fffffff;
      auVar275._12_4_ = 0x7fffffff;
      auVar278 = ZEXT1664(auVar275);
      auVar279 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar251 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar243._4_4_ = uVar251;
      auVar243._0_4_ = uVar251;
      auVar243._8_4_ = uVar251;
      auVar243._12_4_ = uVar251;
      auVar243._16_4_ = uVar251;
      auVar243._20_4_ = uVar251;
      auVar243._24_4_ = uVar251;
      auVar243._28_4_ = uVar251;
      uVar251 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar250._4_4_ = uVar251;
      auVar250._0_4_ = uVar251;
      auVar250._8_4_ = uVar251;
      auVar250._12_4_ = uVar251;
      auVar250._16_4_ = uVar251;
      auVar250._20_4_ = uVar251;
      auVar250._24_4_ = uVar251;
      auVar250._28_4_ = uVar251;
      fVar135 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar273 = ZEXT3264(CONCAT428(fVar135,CONCAT424(fVar135,CONCAT420(fVar135,CONCAT416(fVar135,
                                                  CONCAT412(fVar135,CONCAT48(fVar135,CONCAT44(
                                                  fVar135,fVar135))))))));
      auVar219._0_4_ = fVar135 * auVar265._0_4_;
      auVar219._4_4_ = fVar135 * auVar265._4_4_;
      auVar219._8_4_ = fVar135 * auVar265._8_4_;
      auVar219._12_4_ = fVar135 * auVar265._12_4_;
      auVar219._16_4_ = fVar135 * auVar265._16_4_;
      auVar219._20_4_ = fVar135 * auVar265._20_4_;
      auVar219._28_36_ = auVar265._28_36_;
      auVar219._24_4_ = fVar135 * auVar265._24_4_;
      auVar80 = vfmadd231ps_fma(auVar219._0_32_,auVar250,auVar93);
      auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar243,auVar101);
      _local_440 = _local_5a0;
      local_420 = vminps_avx(local_3e0,auVar116);
      auVar264._8_4_ = 0x7fffffff;
      auVar264._0_8_ = 0x7fffffff7fffffff;
      auVar264._12_4_ = 0x7fffffff;
      auVar264._16_4_ = 0x7fffffff;
      auVar264._20_4_ = 0x7fffffff;
      auVar264._24_4_ = 0x7fffffff;
      auVar264._28_4_ = 0x7fffffff;
      auVar93 = vandps_avx(auVar264,ZEXT1632(auVar80));
      _local_400 = vmaxps_avx(_local_5a0,auVar117);
      auVar237 = ZEXT3264(_local_400);
      auVar152._8_4_ = 0x3e99999a;
      auVar152._0_8_ = 0x3e99999a3e99999a;
      auVar152._12_4_ = 0x3e99999a;
      auVar152._16_4_ = 0x3e99999a;
      auVar152._20_4_ = 0x3e99999a;
      auVar152._24_4_ = 0x3e99999a;
      auVar152._28_4_ = 0x3e99999a;
      uVar23 = vcmpps_avx512vl(auVar93,auVar152,1);
      local_7c4 = (int)uVar23;
      uVar23 = vcmpps_avx512vl(_local_5a0,local_420,2);
      bVar63 = (byte)uVar23 & bVar64;
      _local_580 = _local_400;
      uVar24 = vcmpps_avx512vl(_local_400,local_3e0,2);
      if ((bVar64 & ((byte)uVar24 | (byte)uVar23)) == 0) {
        auVar265 = ZEXT3264(_DAT_02020f20);
      }
      else {
        auVar51._4_4_ = auVar257._4_4_ * fVar135;
        auVar51._0_4_ = auVar257._0_4_ * fVar135;
        auVar51._8_4_ = auVar257._8_4_ * fVar135;
        auVar51._12_4_ = auVar257._12_4_ * fVar135;
        auVar51._16_4_ = auVar257._16_4_ * fVar135;
        auVar51._20_4_ = auVar257._20_4_ * fVar135;
        auVar51._24_4_ = auVar257._24_4_ * fVar135;
        auVar51._28_4_ = 0x3e99999a;
        auVar80 = vfmadd213ps_fma(auVar94,auVar250,auVar51);
        auVar80 = vfmadd213ps_fma(auVar100,auVar243,ZEXT1632(auVar80));
        auVar93 = vandps_avx(auVar264,ZEXT1632(auVar80));
        uVar23 = vcmpps_avx512vl(auVar93,auVar152,1);
        local_7cc = (uint)(byte)~bVar65;
        bVar65 = (byte)uVar23 | ~bVar65;
        auVar153._8_4_ = 2;
        auVar153._0_8_ = 0x200000002;
        auVar153._12_4_ = 2;
        auVar153._16_4_ = 2;
        auVar153._20_4_ = 2;
        auVar153._24_4_ = 2;
        auVar153._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar93 = vpblendmd_avx512vl(auVar153,auVar38);
        local_3c0._0_4_ = (uint)(bVar65 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar65 & 1) * 2;
        bVar14 = (bool)(bVar65 >> 1 & 1);
        local_3c0._4_4_ = (uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 2 & 1);
        local_3c0._8_4_ = (uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 3 & 1);
        local_3c0._12_4_ = (uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 4 & 1);
        local_3c0._16_4_ = (uint)bVar14 * auVar93._16_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 5 & 1);
        local_3c0._20_4_ = (uint)bVar14 * auVar93._20_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 6 & 1);
        local_3c0._24_4_ = (uint)bVar14 * auVar93._24_4_ | (uint)!bVar14 * 2;
        local_3c0._28_4_ = (uint)(bVar65 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar65 >> 7) * 2;
        local_480 = vpbroadcastd_avx512vl();
        uVar23 = vpcmpd_avx512vl(local_480,local_3c0,5);
        local_7c8 = (uint)bVar63;
        bVar63 = (byte)uVar23 & bVar63;
        if (bVar63 != 0) {
          auVar79 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar80 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar73 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar82 = vminps_avx(auVar79,auVar73);
          auVar79 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar73 = vmaxps_avx(auVar80,auVar79);
          auVar80 = vandps_avx(auVar275,auVar82);
          auVar79 = vandps_avx(auVar275,auVar73);
          auVar80 = vmaxps_avx(auVar80,auVar79);
          auVar79 = vmovshdup_avx(auVar80);
          auVar79 = vmaxss_avx(auVar79,auVar80);
          auVar80 = vshufpd_avx(auVar80,auVar80,1);
          auVar80 = vmaxss_avx(auVar80,auVar79);
          fVar135 = auVar80._0_4_ * 1.9073486e-06;
          local_630 = vshufps_avx(auVar73,auVar73,0xff);
          local_500 = (float)local_5a0._0_4_ + (float)local_680._0_4_;
          fStack_4fc = (float)local_5a0._4_4_ + (float)local_680._4_4_;
          fStack_4f8 = fStack_598 + fStack_678;
          fStack_4f4 = fStack_594 + fStack_674;
          fStack_4f0 = fStack_590 + fStack_670;
          fStack_4ec = fStack_58c + fStack_66c;
          fStack_4e8 = fStack_588 + fStack_668;
          fStack_4e4 = fStack_584 + fStack_664;
          _local_5a0 = auVar85;
          do {
            auVar86 = local_860;
            auVar154._8_4_ = 0x7f800000;
            auVar154._0_8_ = 0x7f8000007f800000;
            auVar154._12_4_ = 0x7f800000;
            auVar154._16_4_ = 0x7f800000;
            auVar154._20_4_ = 0x7f800000;
            auVar154._24_4_ = 0x7f800000;
            auVar154._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar154,_local_5a0);
            auVar119._0_4_ =
                 (uint)(bVar63 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
            bVar14 = (bool)(bVar63 >> 1 & 1);
            auVar119._4_4_ = (uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar63 >> 2 & 1);
            auVar119._8_4_ = (uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar63 >> 3 & 1);
            auVar119._12_4_ = (uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar63 >> 4 & 1);
            auVar119._16_4_ = (uint)bVar14 * auVar93._16_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar63 >> 5 & 1);
            auVar119._20_4_ = (uint)bVar14 * auVar93._20_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar63 >> 6 & 1);
            auVar119._24_4_ = (uint)bVar14 * auVar93._24_4_ | (uint)!bVar14 * 0x7f800000;
            auVar119._28_4_ =
                 (uint)(bVar63 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar63 >> 7) * 0x7f800000;
            auVar93 = vshufps_avx(auVar119,auVar119,0xb1);
            auVar93 = vminps_avx(auVar119,auVar93);
            auVar85 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar85);
            auVar85 = vpermpd_avx2(auVar93,0x4e);
            auVar93 = vminps_avx(auVar93,auVar85);
            uVar23 = vcmpps_avx512vl(auVar119,auVar93,0);
            bVar61 = (byte)uVar23 & bVar63;
            bVar65 = bVar63;
            if (bVar61 != 0) {
              bVar65 = bVar61;
            }
            iVar1 = 0;
            for (uVar70 = (uint)bVar65; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
              iVar1 = iVar1 + 1;
            }
            auVar265 = ZEXT464(*(uint *)(local_4c0 + (uint)(iVar1 << 2)));
            auVar255 = ZEXT464(*(uint *)(local_440 + (uint)(iVar1 << 2)));
            aVar6 = (ray->super_RayK<1>).dir.field_0;
            local_660._0_16_ = (undefined1  [16])aVar6;
            auVar80 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
            if (auVar80._0_4_ < 0.0) {
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_4c0 + (uint)(iVar1 << 2)));
              local_880._0_16_ = ZEXT416(*(uint *)(local_440 + (uint)(iVar1 << 2)));
              local_860[1] = 0;
              local_860[0] = bVar63;
              local_860._2_30_ = auVar86._2_30_;
              fVar137 = sqrtf(auVar80._0_4_);
              bVar63 = local_860[0];
              auVar255 = ZEXT1664(local_880._0_16_);
              auVar265 = ZEXT1664(local_8c0._0_16_);
              auVar279 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar80 = vsqrtss_avx(auVar80,auVar80);
              fVar137 = auVar80._0_4_;
            }
            lVar67 = 4;
            do {
              local_880._0_16_ = auVar255._0_16_;
              uVar251 = auVar255._0_4_;
              auVar142._4_4_ = uVar251;
              auVar142._0_4_ = uVar251;
              auVar142._8_4_ = uVar251;
              auVar142._12_4_ = uVar251;
              auVar74 = auVar279._0_16_;
              auVar80 = vfmadd132ps_fma(auVar142,auVar74,local_660._0_16_);
              fVar263 = auVar265._0_4_;
              fVar244 = 1.0 - fVar263;
              fVar165 = fVar244 * fVar244 * fVar244;
              fVar159 = fVar263 * fVar263;
              fVar256 = fVar263 * fVar159;
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar165),
                                        ZEXT416((uint)fVar256));
              fVar138 = fVar263 * fVar244;
              local_860._0_16_ = ZEXT416((uint)fVar244);
              auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar263 * fVar138 * 6.0)),
                                        ZEXT416((uint)(fVar138 * fVar244)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar256),
                                        ZEXT416((uint)fVar165));
              auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar244 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar263 * fVar138)));
              fVar165 = fVar165 * 0.16666667;
              fVar244 = (auVar79._0_4_ + auVar82._0_4_) * 0.16666667;
              fVar263 = (auVar73._0_4_ + auVar21._0_4_) * 0.16666667;
              fVar256 = fVar256 * 0.16666667;
              auVar193._0_4_ = fVar256 * (float)local_700._0_4_;
              auVar193._4_4_ = fVar256 * (float)local_700._4_4_;
              auVar193._8_4_ = fVar256 * fStack_6f8;
              auVar193._12_4_ = fVar256 * fStack_6f4;
              auVar223._4_4_ = fVar263;
              auVar223._0_4_ = fVar263;
              auVar223._8_4_ = fVar263;
              auVar223._12_4_ = fVar263;
              auVar79 = vfmadd132ps_fma(auVar223,auVar193,local_6c0._0_16_);
              auVar194._4_4_ = fVar244;
              auVar194._0_4_ = fVar244;
              auVar194._8_4_ = fVar244;
              auVar194._12_4_ = fVar244;
              auVar79 = vfmadd132ps_fma(auVar194,auVar79,local_6e0._0_16_);
              auVar169._4_4_ = fVar165;
              auVar169._0_4_ = fVar165;
              auVar169._8_4_ = fVar165;
              auVar169._12_4_ = fVar165;
              local_5c0 = vfmadd132ps_fma(auVar169,auVar79,local_6a0._0_16_);
              auVar80 = vsubps_avx(auVar80,local_5c0);
              local_720._0_16_ = auVar80;
              auVar80 = vdpps_avx(auVar80,auVar80,0x7f);
              local_8c0._0_16_ = auVar265._0_16_;
              local_740._0_16_ = auVar80;
              if (auVar80._0_4_ < 0.0) {
                local_7c0._0_4_ = fVar159;
                auVar278._0_4_ = sqrtf(auVar80._0_4_);
                auVar278._4_60_ = extraout_var;
                auVar74 = ZEXT816(0) << 0x40;
                auVar80 = auVar278._0_16_;
                auVar79 = local_8c0._0_16_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
                local_7c0._0_4_ = fVar159;
                auVar79 = auVar265._0_16_;
              }
              local_5d0 = local_860._0_4_;
              fStack_5cc = local_5d0;
              fStack_5c8 = local_5d0;
              fStack_5c4 = local_5d0;
              auVar73 = vfnmsub213ss_fma(auVar79,auVar79,ZEXT416((uint)(fVar138 * 4.0)));
              auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * 4.0)),local_860._0_16_,
                                        local_860._0_16_);
              fVar159 = local_5d0 * -local_5d0 * 0.5;
              fVar138 = auVar73._0_4_ * 0.5;
              fVar165 = auVar79._0_4_ * 0.5;
              local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
              auVar212._0_4_ = (float)local_7c0._0_4_ * (float)local_700._0_4_;
              auVar212._4_4_ = (float)local_7c0._0_4_ * (float)local_700._4_4_;
              auVar212._8_4_ = (float)local_7c0._0_4_ * fStack_6f8;
              auVar212._12_4_ = (float)local_7c0._0_4_ * fStack_6f4;
              auVar170._4_4_ = fVar165;
              auVar170._0_4_ = fVar165;
              auVar170._8_4_ = fVar165;
              auVar170._12_4_ = fVar165;
              auVar79 = vfmadd132ps_fma(auVar170,auVar212,local_6c0._0_16_);
              auVar195._4_4_ = fVar138;
              auVar195._0_4_ = fVar138;
              auVar195._8_4_ = fVar138;
              auVar195._12_4_ = fVar138;
              auVar79 = vfmadd132ps_fma(auVar195,auVar79,local_6e0._0_16_);
              auVar281._4_4_ = fVar159;
              auVar281._0_4_ = fVar159;
              auVar281._8_4_ = fVar159;
              auVar281._12_4_ = fVar159;
              local_7c0._0_16_ = vfmadd132ps_fma(auVar281,auVar79,local_6a0._0_16_);
              local_5e0 = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
              fVar138 = local_5e0._0_4_;
              auVar171._4_12_ = auVar74._4_12_;
              auVar171._0_4_ = fVar138;
              local_820 = vrsqrt14ss_avx512f(auVar74,auVar171);
              fVar159 = local_820._0_4_ * 1.5;
              local_5f0 = vrcp14ss_avx512f(auVar74,auVar171);
              auVar79 = vfnmadd213ss_fma(local_5f0,local_5e0,ZEXT416(0x40000000));
              uVar70 = auVar80._0_4_;
              if (fVar138 < -fVar138) {
                local_830._0_4_ = fVar159;
                auVar265._0_4_ = sqrtf(fVar138);
                auVar265._4_60_ = extraout_var_00;
                auVar80 = ZEXT416(uVar70);
                auVar74 = ZEXT816(0) << 0x40;
                auVar82 = auVar265._0_16_;
                auVar73 = local_7c0._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx512f(local_5e0,local_5e0);
                local_830._0_4_ = fVar159;
                auVar73 = local_7c0._0_16_;
              }
              fVar159 = local_820._0_4_;
              fVar159 = (float)local_830._0_4_ + fVar138 * -0.5 * fVar159 * fVar159 * fVar159;
              local_830._0_4_ = auVar73._0_4_ * fVar159;
              local_830._4_4_ = auVar73._4_4_ * fVar159;
              local_830._8_4_ = auVar73._8_4_ * fVar159;
              local_830._12_4_ = auVar73._12_4_ * fVar159;
              local_820 = vdpps_avx(local_720._0_16_,local_830,0x7f);
              fVar165 = auVar80._0_4_;
              auVar143._0_4_ = local_820._0_4_ * local_820._0_4_;
              auVar143._4_4_ = local_820._4_4_ * local_820._4_4_;
              auVar143._8_4_ = local_820._8_4_ * local_820._8_4_;
              auVar143._12_4_ = local_820._12_4_ * local_820._12_4_;
              auVar21 = vsubps_avx(local_740._0_16_,auVar143);
              fVar138 = auVar21._0_4_;
              auVar172._4_12_ = auVar74._4_12_;
              auVar172._0_4_ = fVar138;
              auVar74 = vrsqrt14ss_avx512f(auVar74,auVar172);
              auVar81 = vmulss_avx512f(auVar74,ZEXT416(0x3fc00000));
              auVar83 = vmulss_avx512f(auVar21,ZEXT416(0xbf000000));
              if (fVar138 < 0.0) {
                local_610 = fVar159;
                fStack_60c = fVar159;
                fStack_608 = fVar159;
                fStack_604 = fVar159;
                local_600 = auVar74;
                fVar138 = sqrtf(fVar138);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar81 = ZEXT416(auVar81._0_4_);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar80 = ZEXT416(uVar70);
                auVar73 = local_7c0._0_16_;
                auVar74 = local_600;
                fVar159 = local_610;
                fVar244 = fStack_60c;
                fVar263 = fStack_608;
                fVar256 = fStack_604;
              }
              else {
                auVar21 = vsqrtss_avx(auVar21,auVar21);
                fVar138 = auVar21._0_4_;
                fVar244 = fVar159;
                fVar263 = fVar159;
                fVar256 = fVar159;
              }
              auVar273 = ZEXT1664(local_740._0_16_);
              auVar257 = ZEXT1664(local_720._0_16_);
              auVar276._8_4_ = 0x7fffffff;
              auVar276._0_8_ = 0x7fffffff7fffffff;
              auVar276._12_4_ = 0x7fffffff;
              auVar278 = ZEXT1664(auVar276);
              auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_,
                                        local_8c0._0_16_);
              auVar21 = vfmadd231ss_fma(local_860._0_16_,local_8c0._0_16_,
                                        SUB6416(ZEXT464(0xc0000000),0));
              fVar259 = local_8c0._0_4_;
              auVar196._0_4_ = fVar259 * (float)local_700._0_4_;
              auVar196._4_4_ = fVar259 * (float)local_700._4_4_;
              auVar196._8_4_ = fVar259 * fStack_6f8;
              auVar196._12_4_ = fVar259 * fStack_6f4;
              auVar213._0_4_ = auVar21._0_4_;
              auVar213._4_4_ = auVar213._0_4_;
              auVar213._8_4_ = auVar213._0_4_;
              auVar213._12_4_ = auVar213._0_4_;
              auVar21 = vfmadd132ps_fma(auVar213,auVar196,local_6c0._0_16_);
              auVar173._0_4_ = auVar75._0_4_;
              auVar173._4_4_ = auVar173._0_4_;
              auVar173._8_4_ = auVar173._0_4_;
              auVar173._12_4_ = auVar173._0_4_;
              auVar21 = vfmadd132ps_fma(auVar173,auVar21,local_6e0._0_16_);
              auVar55._4_4_ = fStack_5cc;
              auVar55._0_4_ = local_5d0;
              auVar55._8_4_ = fStack_5c8;
              auVar55._12_4_ = fStack_5c4;
              auVar21 = vfmadd132ps_fma(auVar55,auVar21,local_6a0._0_16_);
              auVar174._0_4_ = auVar21._0_4_ * (float)local_5e0._0_4_;
              auVar174._4_4_ = auVar21._4_4_ * (float)local_5e0._0_4_;
              auVar174._8_4_ = auVar21._8_4_ * (float)local_5e0._0_4_;
              auVar174._12_4_ = auVar21._12_4_ * (float)local_5e0._0_4_;
              auVar21 = vdpps_avx(auVar73,auVar21,0x7f);
              fVar258 = auVar21._0_4_;
              auVar197._0_4_ = auVar73._0_4_ * fVar258;
              auVar197._4_4_ = auVar73._4_4_ * fVar258;
              auVar197._8_4_ = auVar73._8_4_ * fVar258;
              auVar197._12_4_ = auVar73._12_4_ * fVar258;
              auVar21 = vsubps_avx(auVar174,auVar197);
              fVar258 = auVar79._0_4_ * (float)local_5f0._0_4_;
              auVar31._8_4_ = 0x80000000;
              auVar31._0_8_ = 0x8000000080000000;
              auVar31._12_4_ = 0x80000000;
              auVar84 = vxorps_avx512vl(auVar73,auVar31);
              auVar224._0_4_ = fVar159 * auVar21._0_4_ * fVar258;
              auVar224._4_4_ = fVar244 * auVar21._4_4_ * fVar258;
              auVar224._8_4_ = fVar263 * auVar21._8_4_ * fVar258;
              auVar224._12_4_ = fVar256 * auVar21._12_4_ * fVar258;
              auVar79 = vdpps_avx(auVar84,local_830,0x7f);
              auVar21 = vmaxss_avx(ZEXT416((uint)fVar135),
                                   ZEXT416((uint)((float)local_880._0_4_ * fVar137 * 1.9073486e-06))
                                  );
              auVar75 = vdivss_avx512f(ZEXT416((uint)fVar135),auVar82);
              auVar82 = vdpps_avx(local_720._0_16_,auVar224,0x7f);
              auVar80 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar135),auVar21);
              auVar75 = vfmadd213ss_fma(ZEXT416((uint)(fVar165 + 1.0)),auVar75,auVar80);
              auVar80 = vdpps_avx(local_660._0_16_,local_830,0x7f);
              fVar159 = auVar79._0_4_ + auVar82._0_4_;
              auVar79 = vdpps_avx(local_720._0_16_,auVar84,0x7f);
              auVar83 = vmulss_avx512f(auVar83,auVar74);
              auVar74 = vmulss_avx512f(auVar74,auVar74);
              auVar82 = vdpps_avx(local_720._0_16_,local_660._0_16_,0x7f);
              auVar74 = vaddss_avx512f(auVar81,ZEXT416((uint)(auVar83._0_4_ * auVar74._0_4_)));
              auVar81 = vfnmadd231ss_avx512f(auVar79,local_820,ZEXT416((uint)fVar159));
              auVar83 = vfnmadd231ss_avx512f(auVar82,local_820,auVar80);
              auVar79 = vpermilps_avx(local_5c0,0xff);
              fVar138 = fVar138 - auVar79._0_4_;
              auVar79 = vshufps_avx(auVar73,auVar73,0xff);
              auVar82 = vfmsub213ss_fma(auVar81,auVar74,auVar79);
              fVar165 = auVar83._0_4_ * auVar74._0_4_;
              auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar82._0_4_)),
                                        ZEXT416((uint)fVar159),ZEXT416((uint)fVar165));
              fVar244 = auVar74._0_4_;
              auVar240._0_4_ = fVar165 / fVar244;
              auVar240._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar235._0_4_ = auVar82._0_4_ / fVar244;
              auVar235._4_12_ = auVar82._4_12_;
              auVar82 = vmulss_avx512f(local_820,auVar240);
              auVar74 = vmulss_avx512f(local_820,auVar235);
              auVar237 = ZEXT1664(auVar74);
              fVar259 = fVar259 - (auVar82._0_4_ - fVar138 * (auVar80._0_4_ / fVar244));
              auVar265 = ZEXT464((uint)fVar259);
              fVar159 = (float)local_880._0_4_ - (fVar138 * (fVar159 / fVar244) - auVar74._0_4_);
              auVar255 = ZEXT464((uint)fVar159);
              auVar80 = vandps_avx512vl(local_820,auVar276);
              if (auVar75._0_4_ <= auVar80._0_4_) {
                bVar14 = false;
                auVar279 = ZEXT864(0) << 0x20;
              }
              else {
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ + auVar21._0_4_)),local_630,
                                          ZEXT416(0x36000000));
                auVar80 = vandps_avx(auVar276,ZEXT416((uint)fVar138));
                auVar53._12_4_ = 0;
                auVar53._0_12_ = ZEXT812(0);
                auVar279 = ZEXT1264(ZEXT812(0)) << 0x20;
                if (auVar82._0_4_ <= auVar80._0_4_) {
                  bVar14 = false;
                }
                else {
                  fVar159 = fVar159 + (float)local_620._0_4_;
                  auVar255 = ZEXT464((uint)fVar159);
                  bVar14 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar159) &&
                       (fVar138 = (ray->super_RayK<1>).tfar, fVar159 <= fVar138)) &&
                      (0.0 <= fVar259)) && (fVar259 <= 1.0)) {
                    auVar80 = vrsqrt14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)local_740._0_4_));
                    fVar165 = auVar80._0_4_;
                    pGVar9 = (context->scene->geometries).items[local_8c8].ptr;
                    if ((pGVar9->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar165 = fVar165 * 1.5 + local_740._0_4_ * -0.5 * fVar165 * fVar165 * fVar165
                      ;
                      auVar175._0_4_ = local_720._0_4_ * fVar165;
                      auVar175._4_4_ = local_720._4_4_ * fVar165;
                      auVar175._8_4_ = local_720._8_4_ * fVar165;
                      auVar175._12_4_ = local_720._12_4_ * fVar165;
                      auVar82 = vfmadd213ps_fma(auVar79,auVar175,auVar73);
                      auVar80 = vshufps_avx(auVar175,auVar175,0xc9);
                      auVar79 = vshufps_avx(auVar73,auVar73,0xc9);
                      auVar176._0_4_ = auVar175._0_4_ * auVar79._0_4_;
                      auVar176._4_4_ = auVar175._4_4_ * auVar79._4_4_;
                      auVar176._8_4_ = auVar175._8_4_ * auVar79._8_4_;
                      auVar176._12_4_ = auVar175._12_4_ * auVar79._12_4_;
                      auVar73 = vfmsub231ps_fma(auVar176,auVar73,auVar80);
                      auVar80 = vshufps_avx(auVar73,auVar73,0xc9);
                      auVar79 = vshufps_avx(auVar82,auVar82,0xc9);
                      auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                      auVar144._0_4_ = auVar82._0_4_ * auVar73._0_4_;
                      auVar144._4_4_ = auVar82._4_4_ * auVar73._4_4_;
                      auVar144._8_4_ = auVar82._8_4_ * auVar73._8_4_;
                      auVar144._12_4_ = auVar82._12_4_ * auVar73._12_4_;
                      auVar80 = vfmsub231ps_fma(auVar144,auVar80,auVar79);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar159;
                        auVar79 = vshufps_avx(auVar80,auVar80,0xe9);
                        uVar23 = vmovlps_avx(auVar79);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar23;
                        (ray->Ng).field_0.field_0.z = auVar80._0_4_;
                        ray->u = fVar259;
                        ray->v = 0.0;
                        ray->primID = (uint)local_888;
                        ray->geomID = (uint)local_8c8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar79 = vshufps_avx(auVar80,auVar80,0xe9);
                        local_780 = vmovlps_avx(auVar79);
                        local_778 = auVar80._0_4_;
                        local_774 = fVar259;
                        local_770 = 0;
                        local_76c = (uint)local_888;
                        local_768 = (uint)local_8c8;
                        local_764 = context->user->instID[0];
                        local_760 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar159;
                        local_8cc = -1;
                        local_800.valid = &local_8cc;
                        local_800.geometryUserPtr = pGVar9->userPtr;
                        local_800.context = context->user;
                        local_800.ray = (RTCRayN *)ray;
                        local_800.hit = (RTCHitN *)&local_780;
                        local_800.N = 1;
                        local_8c0._0_16_ = ZEXT416((uint)fVar259);
                        local_880._0_16_ = ZEXT416((uint)fVar159);
                        local_860._0_4_ = fVar138;
                        if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c2f234:
                          p_Var13 = context->args->filter;
                          if (p_Var13 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                              auVar237 = ZEXT1664(auVar237._0_16_);
                              auVar257 = ZEXT1664(auVar257._0_16_);
                              auVar273 = ZEXT1664(auVar273._0_16_);
                              (*p_Var13)(&local_800);
                              auVar255 = ZEXT1664(local_880._0_16_);
                              auVar265 = ZEXT1664(local_8c0._0_16_);
                              auVar279 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar278 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                              fVar138 = (float)local_860._0_4_;
                            }
                            if (*local_800.valid == 0) goto LAB_01c2f2ed;
                          }
                          (((Vec3f *)((long)local_800.ray + 0x30))->field_0).components[0] =
                               *(float *)local_800.hit;
                          (((Vec3f *)((long)local_800.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_800.hit + 4);
                          (((Vec3f *)((long)local_800.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_800.hit + 8);
                          *(float *)((long)local_800.ray + 0x3c) = *(float *)(local_800.hit + 0xc);
                          *(float *)((long)local_800.ray + 0x40) = *(float *)(local_800.hit + 0x10);
                          *(float *)((long)local_800.ray + 0x44) = *(float *)(local_800.hit + 0x14);
                          *(float *)((long)local_800.ray + 0x48) = *(float *)(local_800.hit + 0x18);
                          *(float *)((long)local_800.ray + 0x4c) = *(float *)(local_800.hit + 0x1c);
                          *(float *)((long)local_800.ray + 0x50) = *(float *)(local_800.hit + 0x20);
                        }
                        else {
                          auVar237 = ZEXT1664(auVar74);
                          auVar257 = ZEXT1664(local_720._0_16_);
                          auVar273 = ZEXT1664(local_740._0_16_);
                          (*pGVar9->intersectionFilterN)(&local_800);
                          auVar255 = ZEXT1664(local_880._0_16_);
                          auVar265 = ZEXT1664(local_8c0._0_16_);
                          auVar279 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar278 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          fVar138 = (float)local_860._0_4_;
                          if (*local_800.valid != 0) goto LAB_01c2f234;
LAB_01c2f2ed:
                          (ray->super_RayK<1>).tfar = fVar138;
                        }
                      }
                    }
                  }
                }
              }
              bVar68 = lVar67 != 0;
              lVar67 = lVar67 + -1;
            } while ((!bVar14) && (bVar68));
            auVar59._4_4_ = fStack_4fc;
            auVar59._0_4_ = local_500;
            auVar59._8_4_ = fStack_4f8;
            auVar59._12_4_ = fStack_4f4;
            auVar59._16_4_ = fStack_4f0;
            auVar59._20_4_ = fStack_4ec;
            auVar59._24_4_ = fStack_4e8;
            auVar59._28_4_ = fStack_4e4;
            fVar137 = (ray->super_RayK<1>).tfar;
            auVar39._4_4_ = fVar137;
            auVar39._0_4_ = fVar137;
            auVar39._8_4_ = fVar137;
            auVar39._12_4_ = fVar137;
            auVar39._16_4_ = fVar137;
            auVar39._20_4_ = fVar137;
            auVar39._24_4_ = fVar137;
            auVar39._28_4_ = fVar137;
            uVar23 = vcmpps_avx512vl(auVar59,auVar39,2);
            bVar63 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar63 & (byte)uVar23;
          } while (bVar63 != 0);
        }
        auVar155._0_4_ = (float)local_580._0_4_ + (float)local_680._0_4_;
        auVar155._4_4_ = (float)local_580._4_4_ + (float)local_680._4_4_;
        auVar155._8_4_ = fStack_578 + fStack_678;
        auVar155._12_4_ = fStack_574 + fStack_674;
        auVar155._16_4_ = fStack_570 + fStack_670;
        auVar155._20_4_ = fStack_56c + fStack_66c;
        auVar155._24_4_ = fStack_568 + fStack_668;
        auVar155._28_4_ = fStack_564 + fStack_664;
        fVar135 = (ray->super_RayK<1>).tfar;
        auVar40._4_4_ = fVar135;
        auVar40._0_4_ = fVar135;
        auVar40._8_4_ = fVar135;
        auVar40._12_4_ = fVar135;
        auVar40._16_4_ = fVar135;
        auVar40._20_4_ = fVar135;
        auVar40._24_4_ = fVar135;
        auVar40._28_4_ = fVar135;
        uVar23 = vcmpps_avx512vl(auVar155,auVar40,2);
        bVar65 = (byte)local_7c4 | (byte)local_7cc;
        bVar64 = (byte)uVar24 & bVar64 & (byte)uVar23;
        auVar156._8_4_ = 2;
        auVar156._0_8_ = 0x200000002;
        auVar156._12_4_ = 2;
        auVar156._16_4_ = 2;
        auVar156._20_4_ = 2;
        auVar156._24_4_ = 2;
        auVar156._28_4_ = 2;
        auVar41._8_4_ = 3;
        auVar41._0_8_ = 0x300000003;
        auVar41._12_4_ = 3;
        auVar41._16_4_ = 3;
        auVar41._20_4_ = 3;
        auVar41._24_4_ = 3;
        auVar41._28_4_ = 3;
        auVar93 = vpblendmd_avx512vl(auVar156,auVar41);
        local_580._0_4_ = (uint)(bVar65 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar65 & 1) * 2;
        bVar14 = (bool)(bVar65 >> 1 & 1);
        local_580._4_4_ = (uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 2 & 1);
        fStack_578 = (float)((uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * 2);
        bVar14 = (bool)(bVar65 >> 3 & 1);
        fStack_574 = (float)((uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * 2);
        bVar14 = (bool)(bVar65 >> 4 & 1);
        fStack_570 = (float)((uint)bVar14 * auVar93._16_4_ | (uint)!bVar14 * 2);
        bVar14 = (bool)(bVar65 >> 5 & 1);
        fStack_56c = (float)((uint)bVar14 * auVar93._20_4_ | (uint)!bVar14 * 2);
        bVar14 = (bool)(bVar65 >> 6 & 1);
        fStack_568 = (float)((uint)bVar14 * auVar93._24_4_ | (uint)!bVar14 * 2);
        fStack_564 = (float)((uint)(bVar65 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar65 >> 7) * 2);
        uVar23 = vpcmpd_avx512vl(_local_580,local_480,2);
        bVar65 = (byte)uVar23 & bVar64;
        if (bVar65 != 0) {
          auVar79 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar80 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar73 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar82 = vminps_avx(auVar79,auVar73);
          auVar79 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
          auVar73 = vmaxps_avx(auVar80,auVar79);
          auVar80 = vandps_avx(auVar278._0_16_,auVar82);
          auVar79 = vandps_avx(auVar278._0_16_,auVar73);
          auVar80 = vmaxps_avx(auVar80,auVar79);
          auVar79 = vmovshdup_avx(auVar80);
          auVar79 = vmaxss_avx(auVar79,auVar80);
          auVar80 = vshufpd_avx(auVar80,auVar80,1);
          auVar80 = vmaxss_avx(auVar80,auVar79);
          fVar135 = auVar80._0_4_ * 1.9073486e-06;
          local_630 = vshufps_avx(auVar73,auVar73,0xff);
          _local_5a0 = _local_400;
          local_500 = (float)local_400._0_4_ + (float)local_680._0_4_;
          fStack_4fc = (float)local_400._4_4_ + (float)local_680._4_4_;
          fStack_4f8 = fStack_3f8 + fStack_678;
          fStack_4f4 = fStack_3f4 + fStack_674;
          fStack_4f0 = fStack_3f0 + fStack_670;
          fStack_4ec = fStack_3ec + fStack_66c;
          fStack_4e8 = fStack_3e8 + fStack_668;
          fStack_4e4 = fStack_3e4 + fStack_664;
          do {
            auVar86 = local_860;
            auVar157._8_4_ = 0x7f800000;
            auVar157._0_8_ = 0x7f8000007f800000;
            auVar157._12_4_ = 0x7f800000;
            auVar157._16_4_ = 0x7f800000;
            auVar157._20_4_ = 0x7f800000;
            auVar157._24_4_ = 0x7f800000;
            auVar157._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar157,_local_5a0);
            auVar120._0_4_ =
                 (uint)(bVar65 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar65 & 1) * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 1 & 1);
            auVar120._4_4_ = (uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 2 & 1);
            auVar120._8_4_ = (uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 3 & 1);
            auVar120._12_4_ = (uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 4 & 1);
            auVar120._16_4_ = (uint)bVar14 * auVar93._16_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 5 & 1);
            auVar120._20_4_ = (uint)bVar14 * auVar93._20_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 6 & 1);
            auVar120._24_4_ = (uint)bVar14 * auVar93._24_4_ | (uint)!bVar14 * 0x7f800000;
            auVar120._28_4_ =
                 (uint)(bVar65 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar65 >> 7) * 0x7f800000;
            auVar93 = vshufps_avx(auVar120,auVar120,0xb1);
            auVar93 = vminps_avx(auVar120,auVar93);
            auVar85 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar85);
            auVar85 = vpermpd_avx2(auVar93,0x4e);
            auVar93 = vminps_avx(auVar93,auVar85);
            uVar23 = vcmpps_avx512vl(auVar120,auVar93,0);
            bVar61 = (byte)uVar23 & bVar65;
            bVar63 = bVar65;
            if (bVar61 != 0) {
              bVar63 = bVar61;
            }
            iVar1 = 0;
            for (uVar70 = (uint)bVar63; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
              iVar1 = iVar1 + 1;
            }
            auVar265 = ZEXT464(*(uint *)(local_4e0 + (uint)(iVar1 << 2)));
            auVar257 = ZEXT464(*(uint *)(local_3e0 + (uint)(iVar1 << 2)));
            aVar6 = (ray->super_RayK<1>).dir.field_0;
            local_660._0_16_ = (undefined1  [16])aVar6;
            auVar80 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
            if (auVar80._0_4_ < 0.0) {
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar1 << 2)));
              local_880._0_16_ = ZEXT416(*(uint *)(local_3e0 + (uint)(iVar1 << 2)));
              local_860[1] = 0;
              local_860[0] = bVar65;
              local_860._2_30_ = auVar86._2_30_;
              fVar137 = sqrtf(auVar80._0_4_);
              bVar65 = local_860[0];
              auVar257 = ZEXT1664(local_880._0_16_);
              auVar265 = ZEXT1664(local_8c0._0_16_);
              auVar279 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar80 = vsqrtss_avx(auVar80,auVar80);
              fVar137 = auVar80._0_4_;
            }
            lVar67 = 4;
            do {
              local_880._0_16_ = auVar257._0_16_;
              uVar251 = auVar257._0_4_;
              auVar145._4_4_ = uVar251;
              auVar145._0_4_ = uVar251;
              auVar145._8_4_ = uVar251;
              auVar145._12_4_ = uVar251;
              auVar74 = auVar279._0_16_;
              auVar80 = vfmadd132ps_fma(auVar145,auVar74,local_660._0_16_);
              fVar263 = auVar265._0_4_;
              fVar244 = 1.0 - fVar263;
              fVar165 = fVar244 * fVar244 * fVar244;
              fVar159 = fVar263 * fVar263;
              fVar256 = fVar263 * fVar159;
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar165),
                                        ZEXT416((uint)fVar256));
              fVar138 = fVar263 * fVar244;
              local_860._0_16_ = ZEXT416((uint)fVar244);
              auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar263 * fVar138 * 6.0)),
                                        ZEXT416((uint)(fVar138 * fVar244)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar256),
                                        ZEXT416((uint)fVar165));
              auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar244 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar263 * fVar138)));
              fVar165 = fVar165 * 0.16666667;
              fVar244 = (auVar79._0_4_ + auVar82._0_4_) * 0.16666667;
              fVar263 = (auVar73._0_4_ + auVar21._0_4_) * 0.16666667;
              fVar256 = fVar256 * 0.16666667;
              auVar198._0_4_ = fVar256 * (float)local_700._0_4_;
              auVar198._4_4_ = fVar256 * (float)local_700._4_4_;
              auVar198._8_4_ = fVar256 * fStack_6f8;
              auVar198._12_4_ = fVar256 * fStack_6f4;
              auVar225._4_4_ = fVar263;
              auVar225._0_4_ = fVar263;
              auVar225._8_4_ = fVar263;
              auVar225._12_4_ = fVar263;
              auVar79 = vfmadd132ps_fma(auVar225,auVar198,local_6c0._0_16_);
              auVar199._4_4_ = fVar244;
              auVar199._0_4_ = fVar244;
              auVar199._8_4_ = fVar244;
              auVar199._12_4_ = fVar244;
              auVar79 = vfmadd132ps_fma(auVar199,auVar79,local_6e0._0_16_);
              auVar177._4_4_ = fVar165;
              auVar177._0_4_ = fVar165;
              auVar177._8_4_ = fVar165;
              auVar177._12_4_ = fVar165;
              local_5c0 = vfmadd132ps_fma(auVar177,auVar79,local_6a0._0_16_);
              auVar80 = vsubps_avx(auVar80,local_5c0);
              local_720._0_16_ = auVar80;
              auVar80 = vdpps_avx(auVar80,auVar80,0x7f);
              local_8c0._0_16_ = auVar265._0_16_;
              local_740._0_16_ = auVar80;
              if (auVar80._0_4_ < 0.0) {
                local_7c0._0_4_ = fVar159;
                auVar279._0_4_ = sqrtf(auVar80._0_4_);
                auVar279._4_60_ = extraout_var_01;
                auVar74 = ZEXT816(0) << 0x40;
                auVar80 = auVar279._0_16_;
                auVar79 = local_8c0._0_16_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
                local_7c0._0_4_ = fVar159;
                auVar79 = auVar265._0_16_;
              }
              local_5d0 = local_860._0_4_;
              fStack_5cc = local_5d0;
              fStack_5c8 = local_5d0;
              fStack_5c4 = local_5d0;
              auVar73 = vfnmsub213ss_fma(auVar79,auVar79,ZEXT416((uint)(fVar138 * 4.0)));
              auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * 4.0)),local_860._0_16_,
                                        local_860._0_16_);
              fVar159 = local_5d0 * -local_5d0 * 0.5;
              fVar138 = auVar73._0_4_ * 0.5;
              fVar165 = auVar79._0_4_ * 0.5;
              local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
              auVar214._0_4_ = (float)local_7c0._0_4_ * (float)local_700._0_4_;
              auVar214._4_4_ = (float)local_7c0._0_4_ * (float)local_700._4_4_;
              auVar214._8_4_ = (float)local_7c0._0_4_ * fStack_6f8;
              auVar214._12_4_ = (float)local_7c0._0_4_ * fStack_6f4;
              auVar178._4_4_ = fVar165;
              auVar178._0_4_ = fVar165;
              auVar178._8_4_ = fVar165;
              auVar178._12_4_ = fVar165;
              auVar79 = vfmadd132ps_fma(auVar178,auVar214,local_6c0._0_16_);
              auVar200._4_4_ = fVar138;
              auVar200._0_4_ = fVar138;
              auVar200._8_4_ = fVar138;
              auVar200._12_4_ = fVar138;
              auVar79 = vfmadd132ps_fma(auVar200,auVar79,local_6e0._0_16_);
              auVar282._4_4_ = fVar159;
              auVar282._0_4_ = fVar159;
              auVar282._8_4_ = fVar159;
              auVar282._12_4_ = fVar159;
              local_7c0._0_16_ = vfmadd132ps_fma(auVar282,auVar79,local_6a0._0_16_);
              local_5e0 = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
              fVar138 = local_5e0._0_4_;
              auVar179._4_12_ = auVar74._4_12_;
              auVar179._0_4_ = fVar138;
              local_820 = vrsqrt14ss_avx512f(auVar74,auVar179);
              fVar159 = local_820._0_4_ * 1.5;
              local_5f0 = vrcp14ss_avx512f(auVar74,auVar179);
              auVar79 = vfnmadd213ss_fma(local_5f0,local_5e0,ZEXT416(0x40000000));
              uVar70 = auVar80._0_4_;
              if (fVar138 < -fVar138) {
                local_830._0_4_ = fVar159;
                auVar237._0_4_ = sqrtf(fVar138);
                auVar237._4_60_ = extraout_var_02;
                auVar80 = ZEXT416(uVar70);
                auVar74 = ZEXT816(0) << 0x40;
                auVar82 = auVar237._0_16_;
                auVar73 = local_7c0._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx512f(local_5e0,local_5e0);
                local_830._0_4_ = fVar159;
                auVar73 = local_7c0._0_16_;
              }
              fVar159 = local_820._0_4_;
              fVar159 = (float)local_830._0_4_ + fVar138 * -0.5 * fVar159 * fVar159 * fVar159;
              local_830._0_4_ = auVar73._0_4_ * fVar159;
              local_830._4_4_ = auVar73._4_4_ * fVar159;
              local_830._8_4_ = auVar73._8_4_ * fVar159;
              local_830._12_4_ = auVar73._12_4_ * fVar159;
              local_820 = vdpps_avx(local_720._0_16_,local_830,0x7f);
              fVar165 = auVar80._0_4_;
              auVar146._0_4_ = local_820._0_4_ * local_820._0_4_;
              auVar146._4_4_ = local_820._4_4_ * local_820._4_4_;
              auVar146._8_4_ = local_820._8_4_ * local_820._8_4_;
              auVar146._12_4_ = local_820._12_4_ * local_820._12_4_;
              auVar21 = vsubps_avx(local_740._0_16_,auVar146);
              fVar138 = auVar21._0_4_;
              auVar180._4_12_ = auVar74._4_12_;
              auVar180._0_4_ = fVar138;
              auVar74 = vrsqrt14ss_avx512f(auVar74,auVar180);
              auVar81 = vmulss_avx512f(auVar74,ZEXT416(0x3fc00000));
              auVar83 = vmulss_avx512f(auVar21,ZEXT416(0xbf000000));
              if (fVar138 < 0.0) {
                local_610 = fVar159;
                fStack_60c = fVar159;
                fStack_608 = fVar159;
                fStack_604 = fVar159;
                local_600 = auVar74;
                fVar138 = sqrtf(fVar138);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar81 = ZEXT416(auVar81._0_4_);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar80 = ZEXT416(uVar70);
                auVar73 = local_7c0._0_16_;
                auVar74 = local_600;
                fVar159 = local_610;
                fVar244 = fStack_60c;
                fVar263 = fStack_608;
                fVar256 = fStack_604;
              }
              else {
                auVar21 = vsqrtss_avx(auVar21,auVar21);
                fVar138 = auVar21._0_4_;
                fVar244 = fVar159;
                fVar263 = fVar159;
                fVar256 = fVar159;
              }
              auVar278 = ZEXT1664(local_740._0_16_);
              auVar273 = ZEXT1664(local_720._0_16_);
              auVar254._8_4_ = 0x7fffffff;
              auVar254._0_8_ = 0x7fffffff7fffffff;
              auVar254._12_4_ = 0x7fffffff;
              auVar255 = ZEXT1664(auVar254);
              auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_,
                                        local_8c0._0_16_);
              auVar21 = vfmadd231ss_fma(local_860._0_16_,local_8c0._0_16_,
                                        SUB6416(ZEXT464(0xc0000000),0));
              fVar259 = local_8c0._0_4_;
              auVar201._0_4_ = fVar259 * (float)local_700._0_4_;
              auVar201._4_4_ = fVar259 * (float)local_700._4_4_;
              auVar201._8_4_ = fVar259 * fStack_6f8;
              auVar201._12_4_ = fVar259 * fStack_6f4;
              auVar215._0_4_ = auVar21._0_4_;
              auVar215._4_4_ = auVar215._0_4_;
              auVar215._8_4_ = auVar215._0_4_;
              auVar215._12_4_ = auVar215._0_4_;
              auVar21 = vfmadd132ps_fma(auVar215,auVar201,local_6c0._0_16_);
              auVar181._0_4_ = auVar75._0_4_;
              auVar181._4_4_ = auVar181._0_4_;
              auVar181._8_4_ = auVar181._0_4_;
              auVar181._12_4_ = auVar181._0_4_;
              auVar21 = vfmadd132ps_fma(auVar181,auVar21,local_6e0._0_16_);
              auVar56._4_4_ = fStack_5cc;
              auVar56._0_4_ = local_5d0;
              auVar56._8_4_ = fStack_5c8;
              auVar56._12_4_ = fStack_5c4;
              auVar21 = vfmadd132ps_fma(auVar56,auVar21,local_6a0._0_16_);
              auVar182._0_4_ = auVar21._0_4_ * (float)local_5e0._0_4_;
              auVar182._4_4_ = auVar21._4_4_ * (float)local_5e0._0_4_;
              auVar182._8_4_ = auVar21._8_4_ * (float)local_5e0._0_4_;
              auVar182._12_4_ = auVar21._12_4_ * (float)local_5e0._0_4_;
              auVar21 = vdpps_avx(auVar73,auVar21,0x7f);
              fVar258 = auVar21._0_4_;
              auVar202._0_4_ = auVar73._0_4_ * fVar258;
              auVar202._4_4_ = auVar73._4_4_ * fVar258;
              auVar202._8_4_ = auVar73._8_4_ * fVar258;
              auVar202._12_4_ = auVar73._12_4_ * fVar258;
              auVar21 = vsubps_avx(auVar182,auVar202);
              fVar258 = auVar79._0_4_ * (float)local_5f0._0_4_;
              auVar32._8_4_ = 0x80000000;
              auVar32._0_8_ = 0x8000000080000000;
              auVar32._12_4_ = 0x80000000;
              auVar84 = vxorps_avx512vl(auVar73,auVar32);
              auVar226._0_4_ = fVar159 * auVar21._0_4_ * fVar258;
              auVar226._4_4_ = fVar244 * auVar21._4_4_ * fVar258;
              auVar226._8_4_ = fVar263 * auVar21._8_4_ * fVar258;
              auVar226._12_4_ = fVar256 * auVar21._12_4_ * fVar258;
              auVar79 = vdpps_avx(auVar84,local_830,0x7f);
              auVar21 = vmaxss_avx(ZEXT416((uint)fVar135),
                                   ZEXT416((uint)((float)local_880._0_4_ * fVar137 * 1.9073486e-06))
                                  );
              auVar75 = vdivss_avx512f(ZEXT416((uint)fVar135),auVar82);
              auVar82 = vdpps_avx(local_720._0_16_,auVar226,0x7f);
              auVar80 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar135),auVar21);
              auVar75 = vfmadd213ss_fma(ZEXT416((uint)(fVar165 + 1.0)),auVar75,auVar80);
              auVar80 = vdpps_avx(local_660._0_16_,local_830,0x7f);
              fVar159 = auVar79._0_4_ + auVar82._0_4_;
              auVar79 = vdpps_avx(local_720._0_16_,auVar84,0x7f);
              auVar83 = vmulss_avx512f(auVar83,auVar74);
              auVar74 = vmulss_avx512f(auVar74,auVar74);
              auVar82 = vdpps_avx(local_720._0_16_,local_660._0_16_,0x7f);
              auVar74 = vaddss_avx512f(auVar81,ZEXT416((uint)(auVar83._0_4_ * auVar74._0_4_)));
              auVar81 = vfnmadd231ss_avx512f(auVar79,local_820,ZEXT416((uint)fVar159));
              auVar83 = vfnmadd231ss_avx512f(auVar82,local_820,auVar80);
              auVar79 = vpermilps_avx(local_5c0,0xff);
              fVar138 = fVar138 - auVar79._0_4_;
              auVar79 = vshufps_avx(auVar73,auVar73,0xff);
              auVar82 = vfmsub213ss_fma(auVar81,auVar74,auVar79);
              fVar165 = auVar83._0_4_ * auVar74._0_4_;
              auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar82._0_4_)),
                                        ZEXT416((uint)fVar159),ZEXT416((uint)fVar165));
              fVar244 = auVar74._0_4_;
              auVar241._0_4_ = fVar165 / fVar244;
              auVar241._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar236._0_4_ = auVar82._0_4_ / fVar244;
              auVar236._4_12_ = auVar82._4_12_;
              auVar82 = vmulss_avx512f(local_820,auVar241);
              auVar74 = vmulss_avx512f(local_820,auVar236);
              auVar237 = ZEXT1664(auVar74);
              fVar259 = fVar259 - (auVar82._0_4_ - fVar138 * (auVar80._0_4_ / fVar244));
              auVar265 = ZEXT464((uint)fVar259);
              fVar159 = (float)local_880._0_4_ - (fVar138 * (fVar159 / fVar244) - auVar74._0_4_);
              auVar257 = ZEXT464((uint)fVar159);
              auVar80 = vandps_avx512vl(local_820,auVar254);
              if (auVar75._0_4_ <= auVar80._0_4_) {
                bVar14 = false;
                auVar279 = ZEXT864(0) << 0x20;
              }
              else {
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ + auVar21._0_4_)),local_630,
                                          ZEXT416(0x36000000));
                auVar80 = vandps_avx(auVar254,ZEXT416((uint)fVar138));
                auVar54._12_4_ = 0;
                auVar54._0_12_ = ZEXT812(0);
                auVar279 = ZEXT1264(ZEXT812(0)) << 0x20;
                if (auVar82._0_4_ <= auVar80._0_4_) {
                  bVar14 = false;
                }
                else {
                  fVar159 = fVar159 + (float)local_620._0_4_;
                  auVar257 = ZEXT464((uint)fVar159);
                  bVar14 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar159) &&
                       (fVar138 = (ray->super_RayK<1>).tfar, fVar159 <= fVar138)) &&
                      (0.0 <= fVar259)) && (fVar259 <= 1.0)) {
                    auVar80 = vrsqrt14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)local_740._0_4_));
                    fVar165 = auVar80._0_4_;
                    pGVar9 = (context->scene->geometries).items[local_8c8].ptr;
                    if ((pGVar9->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar165 = fVar165 * 1.5 + local_740._0_4_ * -0.5 * fVar165 * fVar165 * fVar165
                      ;
                      auVar183._0_4_ = local_720._0_4_ * fVar165;
                      auVar183._4_4_ = local_720._4_4_ * fVar165;
                      auVar183._8_4_ = local_720._8_4_ * fVar165;
                      auVar183._12_4_ = local_720._12_4_ * fVar165;
                      auVar82 = vfmadd213ps_fma(auVar79,auVar183,auVar73);
                      auVar80 = vshufps_avx(auVar183,auVar183,0xc9);
                      auVar79 = vshufps_avx(auVar73,auVar73,0xc9);
                      auVar184._0_4_ = auVar183._0_4_ * auVar79._0_4_;
                      auVar184._4_4_ = auVar183._4_4_ * auVar79._4_4_;
                      auVar184._8_4_ = auVar183._8_4_ * auVar79._8_4_;
                      auVar184._12_4_ = auVar183._12_4_ * auVar79._12_4_;
                      auVar73 = vfmsub231ps_fma(auVar184,auVar73,auVar80);
                      auVar80 = vshufps_avx(auVar73,auVar73,0xc9);
                      auVar79 = vshufps_avx(auVar82,auVar82,0xc9);
                      auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                      auVar147._0_4_ = auVar82._0_4_ * auVar73._0_4_;
                      auVar147._4_4_ = auVar82._4_4_ * auVar73._4_4_;
                      auVar147._8_4_ = auVar82._8_4_ * auVar73._8_4_;
                      auVar147._12_4_ = auVar82._12_4_ * auVar73._12_4_;
                      auVar80 = vfmsub231ps_fma(auVar147,auVar80,auVar79);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar159;
                        auVar79 = vshufps_avx(auVar80,auVar80,0xe9);
                        uVar23 = vmovlps_avx(auVar79);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar23;
                        (ray->Ng).field_0.field_0.z = auVar80._0_4_;
                        ray->u = fVar259;
                        ray->v = 0.0;
                        ray->primID = (uint)local_888;
                        ray->geomID = (uint)local_8c8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar79 = vshufps_avx(auVar80,auVar80,0xe9);
                        local_780 = vmovlps_avx(auVar79);
                        local_778 = auVar80._0_4_;
                        local_774 = fVar259;
                        local_770 = 0;
                        local_76c = (uint)local_888;
                        local_768 = (uint)local_8c8;
                        local_764 = context->user->instID[0];
                        local_760 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar159;
                        local_8cc = -1;
                        local_800.valid = &local_8cc;
                        local_800.geometryUserPtr = pGVar9->userPtr;
                        local_800.context = context->user;
                        local_800.ray = (RTCRayN *)ray;
                        local_800.hit = (RTCHitN *)&local_780;
                        local_800.N = 1;
                        local_8c0._0_16_ = ZEXT416((uint)fVar259);
                        local_880._0_16_ = ZEXT416((uint)fVar159);
                        local_860._0_4_ = fVar138;
                        if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c2fd06:
                          p_Var13 = context->args->filter;
                          if (p_Var13 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                              auVar237 = ZEXT1664(auVar237._0_16_);
                              auVar255 = ZEXT1664(auVar255._0_16_);
                              auVar273 = ZEXT1664(auVar273._0_16_);
                              auVar278 = ZEXT1664(auVar278._0_16_);
                              (*p_Var13)(&local_800);
                              auVar257 = ZEXT1664(local_880._0_16_);
                              auVar265 = ZEXT1664(local_8c0._0_16_);
                              auVar279 = ZEXT1664(ZEXT816(0) << 0x40);
                              fVar138 = (float)local_860._0_4_;
                            }
                            if (*local_800.valid == 0) goto LAB_01c2fdb6;
                          }
                          (((Vec3f *)((long)local_800.ray + 0x30))->field_0).components[0] =
                               *(float *)local_800.hit;
                          (((Vec3f *)((long)local_800.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_800.hit + 4);
                          (((Vec3f *)((long)local_800.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_800.hit + 8);
                          *(float *)((long)local_800.ray + 0x3c) = *(float *)(local_800.hit + 0xc);
                          *(float *)((long)local_800.ray + 0x40) = *(float *)(local_800.hit + 0x10);
                          *(float *)((long)local_800.ray + 0x44) = *(float *)(local_800.hit + 0x14);
                          *(float *)((long)local_800.ray + 0x48) = *(float *)(local_800.hit + 0x18);
                          *(float *)((long)local_800.ray + 0x4c) = *(float *)(local_800.hit + 0x1c);
                          *(float *)((long)local_800.ray + 0x50) = *(float *)(local_800.hit + 0x20);
                        }
                        else {
                          auVar237 = ZEXT1664(auVar74);
                          auVar255 = ZEXT1664(auVar254);
                          auVar273 = ZEXT1664(local_720._0_16_);
                          auVar278 = ZEXT1664(local_740._0_16_);
                          (*pGVar9->intersectionFilterN)(&local_800);
                          auVar257 = ZEXT1664(local_880._0_16_);
                          auVar265 = ZEXT1664(local_8c0._0_16_);
                          auVar279 = ZEXT1664(ZEXT816(0) << 0x40);
                          fVar138 = (float)local_860._0_4_;
                          if (*local_800.valid != 0) goto LAB_01c2fd06;
LAB_01c2fdb6:
                          (ray->super_RayK<1>).tfar = fVar138;
                        }
                      }
                    }
                  }
                }
              }
              bVar68 = lVar67 != 0;
              lVar67 = lVar67 + -1;
            } while ((!bVar14) && (bVar68));
            auVar60._4_4_ = fStack_4fc;
            auVar60._0_4_ = local_500;
            auVar60._8_4_ = fStack_4f8;
            auVar60._12_4_ = fStack_4f4;
            auVar60._16_4_ = fStack_4f0;
            auVar60._20_4_ = fStack_4ec;
            auVar60._24_4_ = fStack_4e8;
            auVar60._28_4_ = fStack_4e4;
            fVar137 = (ray->super_RayK<1>).tfar;
            auVar42._4_4_ = fVar137;
            auVar42._0_4_ = fVar137;
            auVar42._8_4_ = fVar137;
            auVar42._12_4_ = fVar137;
            auVar42._16_4_ = fVar137;
            auVar42._20_4_ = fVar137;
            auVar42._24_4_ = fVar137;
            auVar42._28_4_ = fVar137;
            uVar23 = vcmpps_avx512vl(auVar60,auVar42,2);
            bVar65 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar65 & (byte)uVar23;
          } while (bVar65 != 0);
        }
        uVar24 = vpcmpd_avx512vl(local_480,_local_580,1);
        uVar25 = vpcmpd_avx512vl(local_480,local_3c0,1);
        auVar187._0_4_ = (float)local_680._0_4_ + (float)local_440._0_4_;
        auVar187._4_4_ = (float)local_680._4_4_ + (float)local_440._4_4_;
        auVar187._8_4_ = fStack_678 + fStack_438;
        auVar187._12_4_ = fStack_674 + fStack_434;
        auVar187._16_4_ = fStack_670 + fStack_430;
        auVar187._20_4_ = fStack_66c + fStack_42c;
        auVar187._24_4_ = fStack_668 + fStack_428;
        auVar187._28_4_ = fStack_664 + fStack_424;
        fVar135 = (ray->super_RayK<1>).tfar;
        auVar207._4_4_ = fVar135;
        auVar207._0_4_ = fVar135;
        auVar207._8_4_ = fVar135;
        auVar207._12_4_ = fVar135;
        auVar207._16_4_ = fVar135;
        auVar207._20_4_ = fVar135;
        auVar207._24_4_ = fVar135;
        auVar207._28_4_ = fVar135;
        uVar23 = vcmpps_avx512vl(auVar187,auVar207,2);
        bVar65 = (byte)local_7c8 & (byte)uVar25 & (byte)uVar23;
        auVar218._0_4_ = (float)local_680._0_4_ + (float)local_400._0_4_;
        auVar218._4_4_ = (float)local_680._4_4_ + (float)local_400._4_4_;
        auVar218._8_4_ = fStack_678 + fStack_3f8;
        auVar218._12_4_ = fStack_674 + fStack_3f4;
        auVar218._16_4_ = fStack_670 + fStack_3f0;
        auVar218._20_4_ = fStack_66c + fStack_3ec;
        auVar218._24_4_ = fStack_668 + fStack_3e8;
        auVar218._28_4_ = fStack_664 + fStack_3e4;
        uVar23 = vcmpps_avx512vl(auVar218,auVar207,2);
        bVar64 = bVar64 & (byte)uVar24 & (byte)uVar23 | bVar65;
        if (bVar64 == 0) {
          auVar265 = ZEXT3264(_DAT_02020f20);
        }
        else {
          uVar69 = local_808 & 0xffffffff;
          abStack_180[uVar69 * 0x60] = bVar64;
          bVar14 = (bool)(bVar65 >> 1 & 1);
          bVar68 = (bool)(bVar65 >> 2 & 1);
          bVar15 = (bool)(bVar65 >> 3 & 1);
          bVar16 = (bool)(bVar65 >> 4 & 1);
          bVar17 = (bool)(bVar65 >> 5 & 1);
          bVar18 = (bool)(bVar65 >> 6 & 1);
          auStack_160[uVar69 * 0x18] =
               (uint)(bVar65 & 1) * local_440._0_4_ | (uint)!(bool)(bVar65 & 1) * local_400._0_4_;
          auStack_160[uVar69 * 0x18 + 1] =
               (uint)bVar14 * local_440._4_4_ | (uint)!bVar14 * local_400._4_4_;
          auStack_160[uVar69 * 0x18 + 2] =
               (uint)bVar68 * (int)fStack_438 | (uint)!bVar68 * (int)fStack_3f8;
          auStack_160[uVar69 * 0x18 + 3] =
               (uint)bVar15 * (int)fStack_434 | (uint)!bVar15 * (int)fStack_3f4;
          auStack_160[uVar69 * 0x18 + 4] =
               (uint)bVar16 * (int)fStack_430 | (uint)!bVar16 * (int)fStack_3f0;
          afStack_140[uVar69 * 0x18 + -3] =
               (float)((uint)bVar17 * (int)fStack_42c | (uint)!bVar17 * (int)fStack_3ec);
          afStack_140[uVar69 * 0x18 + -2] =
               (float)((uint)bVar18 * (int)fStack_428 | (uint)!bVar18 * (int)fStack_3e8);
          afStack_140[uVar69 * 0x18 + -1] =
               (float)((uint)(bVar65 >> 7) * (int)fStack_424 |
                      (uint)!(bool)(bVar65 >> 7) * (int)fStack_3e4);
          uVar23 = vmovlps_avx(local_790);
          *(undefined8 *)(afStack_140 + uVar69 * 0x18) = uVar23;
          auStack_138[uVar69 * 0x18] = (int)local_748 + 1;
          local_808 = (ulong)((int)local_808 + 1);
          auVar265 = ZEXT3264(_DAT_02020f20);
        }
      }
    }
    auVar219 = ZEXT1664(local_790);
    fVar135 = (ray->super_RayK<1>).tfar;
    auVar151._4_4_ = fVar135;
    auVar151._0_4_ = fVar135;
    auVar151._8_4_ = fVar135;
    auVar151._12_4_ = fVar135;
    auVar151._16_4_ = fVar135;
    auVar151._20_4_ = fVar135;
    auVar151._24_4_ = fVar135;
    auVar151._28_4_ = fVar135;
    local_808 = local_808 & 0xffffffff;
    do {
      if ((int)local_808 == 0) {
        fVar135 = (ray->super_RayK<1>).tfar;
        auVar33._4_4_ = fVar135;
        auVar33._0_4_ = fVar135;
        auVar33._8_4_ = fVar135;
        auVar33._12_4_ = fVar135;
        uVar23 = vcmpps_avx512vl(local_490,auVar33,2);
        uVar70 = (uint)uVar23 & (uint)local_5a8 - 1 & (uint)local_5a8;
        uVar69 = (ulong)uVar70;
        if (uVar70 == 0) {
          return;
        }
        goto LAB_01c2d8ae;
      }
      uVar69 = (ulong)((int)local_808 - 1);
      auVar93 = *(undefined1 (*) [32])(auStack_160 + uVar69 * 0x18);
      auVar204._0_4_ = (float)local_680._0_4_ + auVar93._0_4_;
      auVar204._4_4_ = (float)local_680._4_4_ + auVar93._4_4_;
      auVar204._8_4_ = fStack_678 + auVar93._8_4_;
      auVar204._12_4_ = fStack_674 + auVar93._12_4_;
      auVar204._16_4_ = fStack_670 + auVar93._16_4_;
      auVar204._20_4_ = fStack_66c + auVar93._20_4_;
      auVar204._24_4_ = fStack_668 + auVar93._24_4_;
      auVar204._28_4_ = fStack_664 + auVar93._28_4_;
      uVar23 = vcmpps_avx512vl(auVar204,auVar151,2);
      uVar70 = (uint)uVar23 & (uint)abStack_180[uVar69 * 0x60];
      bVar64 = (byte)uVar70;
      if (uVar70 != 0) {
        auVar205._8_4_ = 0x7f800000;
        auVar205._0_8_ = 0x7f8000007f800000;
        auVar205._12_4_ = 0x7f800000;
        auVar205._16_4_ = 0x7f800000;
        auVar205._20_4_ = 0x7f800000;
        auVar205._24_4_ = 0x7f800000;
        auVar205._28_4_ = 0x7f800000;
        auVar85 = vblendmps_avx512vl(auVar205,auVar93);
        auVar118._0_4_ =
             (uint)(bVar64 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar64 & 1) * (int)auVar93._0_4_;
        bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar14 * auVar85._4_4_ | (uint)!bVar14 * (int)auVar93._4_4_;
        bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar14 * auVar85._8_4_ | (uint)!bVar14 * (int)auVar93._8_4_;
        bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar14 * auVar85._12_4_ | (uint)!bVar14 * (int)auVar93._12_4_;
        bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar118._16_4_ = (uint)bVar14 * auVar85._16_4_ | (uint)!bVar14 * (int)auVar93._16_4_;
        bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar118._20_4_ = (uint)bVar14 * auVar85._20_4_ | (uint)!bVar14 * (int)auVar93._20_4_;
        bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar118._24_4_ = (uint)bVar14 * auVar85._24_4_ | (uint)!bVar14 * (int)auVar93._24_4_;
        auVar118._28_4_ =
             (uVar70 >> 7) * auVar85._28_4_ | (uint)!SUB41(uVar70 >> 7,0) * (int)auVar93._28_4_;
        auVar93 = vshufps_avx(auVar118,auVar118,0xb1);
        auVar93 = vminps_avx(auVar118,auVar93);
        auVar85 = vshufpd_avx(auVar93,auVar93,5);
        auVar93 = vminps_avx(auVar93,auVar85);
        auVar85 = vpermpd_avx2(auVar93,0x4e);
        auVar93 = vminps_avx(auVar93,auVar85);
        uVar23 = vcmpps_avx512vl(auVar118,auVar93,0);
        bVar65 = (byte)uVar23 & bVar64;
        if (bVar65 != 0) {
          uVar70 = (uint)bVar65;
        }
        fVar135 = afStack_140[uVar69 * 0x18 + 1];
        uVar121 = 0;
        for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
          uVar121 = uVar121 + 1;
        }
        local_748 = (ulong)auStack_138[uVar69 * 0x18];
        bVar65 = ~('\x01' << ((byte)uVar121 & 0x1f)) & bVar64;
        abStack_180[uVar69 * 0x60] = bVar65;
        uVar62 = uVar69;
        if (bVar65 != 0) {
          uVar62 = local_808;
        }
        fVar137 = afStack_140[uVar69 * 0x18];
        auVar206._4_4_ = fVar137;
        auVar206._0_4_ = fVar137;
        auVar206._8_4_ = fVar137;
        auVar206._12_4_ = fVar137;
        auVar206._16_4_ = fVar137;
        auVar206._20_4_ = fVar137;
        auVar206._24_4_ = fVar137;
        auVar206._28_4_ = fVar137;
        fVar135 = fVar135 - fVar137;
        auVar186._4_4_ = fVar135;
        auVar186._0_4_ = fVar135;
        auVar186._8_4_ = fVar135;
        auVar186._12_4_ = fVar135;
        auVar186._16_4_ = fVar135;
        auVar186._20_4_ = fVar135;
        auVar186._24_4_ = fVar135;
        auVar186._28_4_ = fVar135;
        auVar80 = vfmadd132ps_fma(auVar186,auVar206,auVar265._0_32_);
        _local_440 = ZEXT1632(auVar80);
        auVar219 = ZEXT864(*(ulong *)(local_440 + (ulong)uVar121 * 4));
        uVar69 = uVar62;
      }
      local_808 = uVar69;
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    } while (bVar64 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }